

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  bool bVar65;
  uint uVar66;
  uint uVar67;
  int iVar68;
  ulong uVar69;
  long lVar70;
  uint uVar71;
  ulong uVar73;
  long lVar74;
  LinearSpace3fa *pLVar75;
  bool bVar76;
  float fVar77;
  float fVar99;
  float fVar101;
  vint4 bi_2;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar100;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar105;
  vint4 bi_1;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar153;
  float fVar179;
  float fVar181;
  vint4 ai_1;
  undefined1 auVar155 [16];
  float fVar183;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar154;
  float fVar180;
  float fVar182;
  float fVar184;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar185;
  float fVar186;
  float fVar204;
  float fVar207;
  vint4 ai_2;
  undefined1 auVar187 [16];
  float fVar209;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar205;
  float fVar208;
  float fVar210;
  undefined1 auVar201 [32];
  float fVar206;
  float fVar211;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar212;
  float fVar226;
  float fVar227;
  undefined1 auVar213 [16];
  float fVar228;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  float fVar244;
  float fVar246;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar247;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar238 [16];
  float fVar245;
  float fVar248;
  float fVar249;
  undefined1 auVar243 [32];
  vint4 ai;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar296;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar297;
  float fVar298;
  undefined1 auVar295 [32];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  float fVar311;
  float fVar319;
  float fVar320;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar321;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar333;
  float fVar334;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar335;
  undefined1 auVar332 [16];
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar347 [16];
  undefined1 auVar346 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  float fVar351;
  float fVar352;
  undefined1 auVar350 [32];
  float fVar353;
  float fVar358;
  float fVar359;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  vfloat4 a0;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar367 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5f9;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_418;
  LinearSpace3fa *local_410;
  Primitive *local_408;
  ulong local_400;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  uint auStack_398 [4];
  RTCFilterFunctionNArguments local_388;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar72;
  undefined1 auVar178 [32];
  undefined1 auVar366 [32];
  
  PVar7 = prim[1];
  uVar69 = (ulong)(byte)PVar7;
  lVar70 = uVar69 * 0x25;
  auVar119 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar119 = vinsertps_avx(auVar119,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar193 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar193 = vinsertps_avx(auVar193,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar105 = *(float *)(prim + lVar70 + 0x12);
  auVar119 = vsubps_avx(auVar119,*(undefined1 (*) [16])(prim + lVar70 + 6));
  auVar106._0_4_ = fVar105 * auVar119._0_4_;
  auVar106._4_4_ = fVar105 * auVar119._4_4_;
  auVar106._8_4_ = fVar105 * auVar119._8_4_;
  auVar106._12_4_ = fVar105 * auVar119._12_4_;
  auVar250._0_4_ = fVar105 * auVar193._0_4_;
  auVar250._4_4_ = fVar105 * auVar193._4_4_;
  auVar250._8_4_ = fVar105 * auVar193._8_4_;
  auVar250._12_4_ = fVar105 * auVar193._12_4_;
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar224 = vcvtdq2ps_avx(auVar224);
  auVar270 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xf + 6)));
  auVar270 = vcvtdq2ps_avx(auVar270);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar69 + 6)));
  auVar171 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1a + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1b + 6)));
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1c + 6)));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar92 = vshufps_avx(auVar250,auVar250,0);
  auVar141 = vshufps_avx(auVar250,auVar250,0x55);
  auVar15 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar105 = auVar15._0_4_;
  fVar77 = auVar15._4_4_;
  fVar99 = auVar15._8_4_;
  fVar101 = auVar15._12_4_;
  fVar185 = auVar141._0_4_;
  fVar204 = auVar141._4_4_;
  fVar207 = auVar141._8_4_;
  fVar209 = auVar141._12_4_;
  fVar153 = auVar92._0_4_;
  fVar179 = auVar92._4_4_;
  fVar181 = auVar92._8_4_;
  fVar183 = auVar92._12_4_;
  auVar326._0_4_ = fVar153 * auVar119._0_4_ + fVar185 * auVar193._0_4_ + fVar105 * auVar224._0_4_;
  auVar326._4_4_ = fVar179 * auVar119._4_4_ + fVar204 * auVar193._4_4_ + fVar77 * auVar224._4_4_;
  auVar326._8_4_ = fVar181 * auVar119._8_4_ + fVar207 * auVar193._8_4_ + fVar99 * auVar224._8_4_;
  auVar326._12_4_ =
       fVar183 * auVar119._12_4_ + fVar209 * auVar193._12_4_ + fVar101 * auVar224._12_4_;
  auVar343._0_4_ = fVar153 * auVar270._0_4_ + fVar185 * auVar14._0_4_ + auVar138._0_4_ * fVar105;
  auVar343._4_4_ = fVar179 * auVar270._4_4_ + fVar204 * auVar14._4_4_ + auVar138._4_4_ * fVar77;
  auVar343._8_4_ = fVar181 * auVar270._8_4_ + fVar207 * auVar14._8_4_ + auVar138._8_4_ * fVar99;
  auVar343._12_4_ = fVar183 * auVar270._12_4_ + fVar209 * auVar14._12_4_ + auVar138._12_4_ * fVar101
  ;
  auVar251._0_4_ = fVar153 * auVar171._0_4_ + fVar185 * auVar118._0_4_ + auVar170._0_4_ * fVar105;
  auVar251._4_4_ = fVar179 * auVar171._4_4_ + fVar204 * auVar118._4_4_ + auVar170._4_4_ * fVar77;
  auVar251._8_4_ = fVar181 * auVar171._8_4_ + fVar207 * auVar118._8_4_ + auVar170._8_4_ * fVar99;
  auVar251._12_4_ =
       fVar183 * auVar171._12_4_ + fVar209 * auVar118._12_4_ + auVar170._12_4_ * fVar101;
  auVar92 = vshufps_avx(auVar106,auVar106,0);
  auVar141 = vshufps_avx(auVar106,auVar106,0x55);
  auVar15 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar105 = auVar15._0_4_;
  fVar77 = auVar15._4_4_;
  fVar99 = auVar15._8_4_;
  fVar101 = auVar15._12_4_;
  fVar185 = auVar141._0_4_;
  fVar204 = auVar141._4_4_;
  fVar207 = auVar141._8_4_;
  fVar209 = auVar141._12_4_;
  fVar153 = auVar92._0_4_;
  fVar179 = auVar92._4_4_;
  fVar181 = auVar92._8_4_;
  fVar183 = auVar92._12_4_;
  auVar130._0_4_ = fVar153 * auVar119._0_4_ + fVar185 * auVar193._0_4_ + fVar105 * auVar224._0_4_;
  auVar130._4_4_ = fVar179 * auVar119._4_4_ + fVar204 * auVar193._4_4_ + fVar77 * auVar224._4_4_;
  auVar130._8_4_ = fVar181 * auVar119._8_4_ + fVar207 * auVar193._8_4_ + fVar99 * auVar224._8_4_;
  auVar130._12_4_ =
       fVar183 * auVar119._12_4_ + fVar209 * auVar193._12_4_ + fVar101 * auVar224._12_4_;
  auVar107._0_4_ = fVar153 * auVar270._0_4_ + auVar138._0_4_ * fVar105 + fVar185 * auVar14._0_4_;
  auVar107._4_4_ = fVar179 * auVar270._4_4_ + auVar138._4_4_ * fVar77 + fVar204 * auVar14._4_4_;
  auVar107._8_4_ = fVar181 * auVar270._8_4_ + auVar138._8_4_ * fVar99 + fVar207 * auVar14._8_4_;
  auVar107._12_4_ = fVar183 * auVar270._12_4_ + auVar138._12_4_ * fVar101 + fVar209 * auVar14._12_4_
  ;
  auVar78._0_4_ = fVar153 * auVar171._0_4_ + fVar185 * auVar118._0_4_ + auVar170._0_4_ * fVar105;
  auVar78._4_4_ = fVar179 * auVar171._4_4_ + fVar204 * auVar118._4_4_ + auVar170._4_4_ * fVar77;
  auVar78._8_4_ = fVar181 * auVar171._8_4_ + fVar207 * auVar118._8_4_ + auVar170._8_4_ * fVar99;
  auVar78._12_4_ = fVar183 * auVar171._12_4_ + fVar209 * auVar118._12_4_ + auVar170._12_4_ * fVar101
  ;
  auVar230._8_4_ = 0x7fffffff;
  auVar230._0_8_ = 0x7fffffff7fffffff;
  auVar230._12_4_ = 0x7fffffff;
  auVar119 = vandps_avx(auVar326,auVar230);
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  auVar119 = vcmpps_avx(auVar119,auVar187,1);
  auVar193 = vblendvps_avx(auVar326,auVar187,auVar119);
  auVar119 = vandps_avx(auVar343,auVar230);
  auVar119 = vcmpps_avx(auVar119,auVar187,1);
  auVar224 = vblendvps_avx(auVar343,auVar187,auVar119);
  auVar119 = vandps_avx(auVar251,auVar230);
  auVar119 = vcmpps_avx(auVar119,auVar187,1);
  auVar119 = vblendvps_avx(auVar251,auVar187,auVar119);
  auVar270 = vrcpps_avx(auVar193);
  fVar153 = auVar270._0_4_;
  auVar155._0_4_ = fVar153 * auVar193._0_4_;
  fVar179 = auVar270._4_4_;
  auVar155._4_4_ = fVar179 * auVar193._4_4_;
  fVar181 = auVar270._8_4_;
  auVar155._8_4_ = fVar181 * auVar193._8_4_;
  fVar183 = auVar270._12_4_;
  auVar155._12_4_ = fVar183 * auVar193._12_4_;
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = &DAT_3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar193 = vsubps_avx(auVar252,auVar155);
  fVar153 = fVar153 + fVar153 * auVar193._0_4_;
  fVar179 = fVar179 + fVar179 * auVar193._4_4_;
  fVar181 = fVar181 + fVar181 * auVar193._8_4_;
  fVar183 = fVar183 + fVar183 * auVar193._12_4_;
  auVar193 = vrcpps_avx(auVar224);
  fVar185 = auVar193._0_4_;
  auVar213._0_4_ = fVar185 * auVar224._0_4_;
  fVar204 = auVar193._4_4_;
  auVar213._4_4_ = fVar204 * auVar224._4_4_;
  fVar207 = auVar193._8_4_;
  auVar213._8_4_ = fVar207 * auVar224._8_4_;
  fVar209 = auVar193._12_4_;
  auVar213._12_4_ = fVar209 * auVar224._12_4_;
  auVar193 = vsubps_avx(auVar252,auVar213);
  fVar185 = fVar185 + fVar185 * auVar193._0_4_;
  fVar204 = fVar204 + fVar204 * auVar193._4_4_;
  fVar207 = fVar207 + fVar207 * auVar193._8_4_;
  fVar209 = fVar209 + fVar209 * auVar193._12_4_;
  auVar193 = vrcpps_avx(auVar119);
  fVar212 = auVar193._0_4_;
  auVar231._0_4_ = fVar212 * auVar119._0_4_;
  fVar226 = auVar193._4_4_;
  auVar231._4_4_ = fVar226 * auVar119._4_4_;
  fVar227 = auVar193._8_4_;
  auVar231._8_4_ = fVar227 * auVar119._8_4_;
  fVar228 = auVar193._12_4_;
  auVar231._12_4_ = fVar228 * auVar119._12_4_;
  auVar119 = vsubps_avx(auVar252,auVar231);
  fVar212 = fVar212 + fVar212 * auVar119._0_4_;
  fVar226 = fVar226 + fVar226 * auVar119._4_4_;
  fVar227 = fVar227 + fVar227 * auVar119._8_4_;
  fVar228 = fVar228 + fVar228 * auVar119._12_4_;
  auVar119 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar70 + 0x16)) *
                           *(float *)(prim + lVar70 + 0x1a)));
  auVar224 = vshufps_avx(auVar119,auVar119,0);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar119 = vpmovsxwd_avx(auVar119);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar193 = vpmovsxwd_avx(auVar193);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar119);
  fVar105 = auVar224._0_4_;
  fVar77 = auVar224._4_4_;
  fVar99 = auVar224._8_4_;
  fVar101 = auVar224._12_4_;
  auVar253._0_4_ = auVar193._0_4_ * fVar105 + auVar119._0_4_;
  auVar253._4_4_ = auVar193._4_4_ * fVar77 + auVar119._4_4_;
  auVar253._8_4_ = auVar193._8_4_ * fVar99 + auVar119._8_4_;
  auVar253._12_4_ = auVar193._12_4_ * fVar101 + auVar119._12_4_;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar119 = vpmovsxwd_avx(auVar224);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar193 = vpmovsxwd_avx(auVar270);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar119);
  auVar263._0_4_ = auVar193._0_4_ * fVar105 + auVar119._0_4_;
  auVar263._4_4_ = auVar193._4_4_ * fVar77 + auVar119._4_4_;
  auVar263._8_4_ = auVar193._8_4_ * fVar99 + auVar119._8_4_;
  auVar263._12_4_ = auVar193._12_4_ * fVar101 + auVar119._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar119 = vpmovsxwd_avx(auVar14);
  auVar119 = vcvtdq2ps_avx(auVar119);
  uVar73 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar69 * 2 + uVar73 + 6);
  auVar193 = vpmovsxwd_avx(auVar138);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar119);
  auVar284._0_4_ = auVar193._0_4_ * fVar105 + auVar119._0_4_;
  auVar284._4_4_ = auVar193._4_4_ * fVar77 + auVar119._4_4_;
  auVar284._8_4_ = auVar193._8_4_ * fVar99 + auVar119._8_4_;
  auVar284._12_4_ = auVar193._12_4_ * fVar101 + auVar119._12_4_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar119 = vpmovsxwd_avx(auVar171);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar69 * 0x18 + 6);
  auVar193 = vpmovsxwd_avx(auVar118);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar119);
  auVar299._0_4_ = auVar193._0_4_ * fVar105 + auVar119._0_4_;
  auVar299._4_4_ = auVar193._4_4_ * fVar77 + auVar119._4_4_;
  auVar299._8_4_ = auVar193._8_4_ * fVar99 + auVar119._8_4_;
  auVar299._12_4_ = auVar193._12_4_ * fVar101 + auVar119._12_4_;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar69 * 0x1d + 6);
  auVar119 = vpmovsxwd_avx(auVar170);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar69 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar193 = vpmovsxwd_avx(auVar92);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar224 = vsubps_avx(auVar193,auVar119);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar69) + 6);
  auVar193 = vpmovsxwd_avx(auVar141);
  auVar312._0_4_ = auVar224._0_4_ * fVar105 + auVar119._0_4_;
  auVar312._4_4_ = auVar224._4_4_ * fVar77 + auVar119._4_4_;
  auVar312._8_4_ = auVar224._8_4_ * fVar99 + auVar119._8_4_;
  auVar312._12_4_ = auVar224._12_4_ * fVar101 + auVar119._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar69 * 0x23 + 6);
  auVar224 = vpmovsxwd_avx(auVar15);
  auVar119 = vcvtdq2ps_avx(auVar193);
  auVar193 = vcvtdq2ps_avx(auVar224);
  auVar193 = vsubps_avx(auVar193,auVar119);
  auVar232._0_4_ = auVar119._0_4_ + auVar193._0_4_ * fVar105;
  auVar232._4_4_ = auVar119._4_4_ + auVar193._4_4_ * fVar77;
  auVar232._8_4_ = auVar119._8_4_ + auVar193._8_4_ * fVar99;
  auVar232._12_4_ = auVar119._12_4_ + auVar193._12_4_ * fVar101;
  auVar119 = vsubps_avx(auVar253,auVar130);
  auVar254._0_4_ = fVar153 * auVar119._0_4_;
  auVar254._4_4_ = fVar179 * auVar119._4_4_;
  auVar254._8_4_ = fVar181 * auVar119._8_4_;
  auVar254._12_4_ = fVar183 * auVar119._12_4_;
  auVar119 = vsubps_avx(auVar263,auVar130);
  auVar131._0_4_ = fVar153 * auVar119._0_4_;
  auVar131._4_4_ = fVar179 * auVar119._4_4_;
  auVar131._8_4_ = fVar181 * auVar119._8_4_;
  auVar131._12_4_ = fVar183 * auVar119._12_4_;
  auVar119 = vsubps_avx(auVar284,auVar107);
  auVar156._0_4_ = fVar185 * auVar119._0_4_;
  auVar156._4_4_ = fVar204 * auVar119._4_4_;
  auVar156._8_4_ = fVar207 * auVar119._8_4_;
  auVar156._12_4_ = fVar209 * auVar119._12_4_;
  auVar119 = vsubps_avx(auVar299,auVar107);
  auVar108._0_4_ = fVar185 * auVar119._0_4_;
  auVar108._4_4_ = fVar204 * auVar119._4_4_;
  auVar108._8_4_ = fVar207 * auVar119._8_4_;
  auVar108._12_4_ = fVar209 * auVar119._12_4_;
  auVar119 = vsubps_avx(auVar312,auVar78);
  auVar188._0_4_ = fVar212 * auVar119._0_4_;
  auVar188._4_4_ = fVar226 * auVar119._4_4_;
  auVar188._8_4_ = fVar227 * auVar119._8_4_;
  auVar188._12_4_ = fVar228 * auVar119._12_4_;
  auVar119 = vsubps_avx(auVar232,auVar78);
  auVar79._0_4_ = fVar212 * auVar119._0_4_;
  auVar79._4_4_ = fVar226 * auVar119._4_4_;
  auVar79._8_4_ = fVar227 * auVar119._8_4_;
  auVar79._12_4_ = fVar228 * auVar119._12_4_;
  auVar119 = vpminsd_avx(auVar254,auVar131);
  auVar193 = vpminsd_avx(auVar156,auVar108);
  auVar119 = vmaxps_avx(auVar119,auVar193);
  auVar193 = vpminsd_avx(auVar188,auVar79);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar264._4_4_ = uVar5;
  auVar264._0_4_ = uVar5;
  auVar264._8_4_ = uVar5;
  auVar264._12_4_ = uVar5;
  auVar193 = vmaxps_avx(auVar193,auVar264);
  auVar119 = vmaxps_avx(auVar119,auVar193);
  local_2f8._0_4_ = auVar119._0_4_ * 0.99999964;
  local_2f8._4_4_ = auVar119._4_4_ * 0.99999964;
  local_2f8._8_4_ = auVar119._8_4_ * 0.99999964;
  local_2f8._12_4_ = auVar119._12_4_ * 0.99999964;
  auVar119 = vpmaxsd_avx(auVar254,auVar131);
  auVar193 = vpmaxsd_avx(auVar156,auVar108);
  auVar119 = vminps_avx(auVar119,auVar193);
  auVar193 = vpmaxsd_avx(auVar188,auVar79);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar5;
  auVar132._0_4_ = uVar5;
  auVar132._8_4_ = uVar5;
  auVar132._12_4_ = uVar5;
  auVar193 = vminps_avx(auVar193,auVar132);
  auVar119 = vminps_avx(auVar119,auVar193);
  auVar80._0_4_ = auVar119._0_4_ * 1.0000004;
  auVar80._4_4_ = auVar119._4_4_ * 1.0000004;
  auVar80._8_4_ = auVar119._8_4_ * 1.0000004;
  auVar80._12_4_ = auVar119._12_4_ * 1.0000004;
  auVar119 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar193 = vpcmpgtd_avx(auVar119,_DAT_01ff0cf0);
  auVar119 = vcmpps_avx(local_2f8,auVar80,2);
  auVar119 = vandps_avx(auVar119,auVar193);
  uVar66 = vmovmskps_avx(auVar119);
  local_5f9 = uVar66 != 0;
  if (uVar66 == 0) {
    return local_5f9;
  }
  uVar66 = uVar66 & 0xff;
  pLVar75 = pre->ray_space + k;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_228 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  local_418 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar367 = ZEXT464(0) << 0x20;
  local_410 = pLVar75;
  local_408 = prim;
LAB_01090722:
  lVar70 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
    }
  }
  local_400 = (ulong)*(uint *)(local_408 + 2);
  pGVar8 = (context->scene->geometries).items[local_400].ptr;
  fVar105 = (pGVar8->time_range).lower;
  fVar105 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar105) / ((pGVar8->time_range).upper - fVar105));
  auVar119 = vroundss_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105),9);
  auVar119 = vminss_avx(auVar119,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar119 = vmaxss_avx(ZEXT816(0) << 0x20,auVar119);
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_408 + lVar70 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar74 = (long)(int)auVar119._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar74);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar74);
  pfVar4 = (float *)(lVar10 + lVar11 * uVar69);
  fVar77 = *pfVar4;
  fVar99 = pfVar4[1];
  fVar101 = pfVar4[2];
  fVar153 = pfVar4[3];
  lVar1 = uVar69 + 1;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar1);
  fVar179 = *pfVar4;
  fVar181 = pfVar4[1];
  fVar183 = pfVar4[2];
  fVar185 = pfVar4[3];
  lVar2 = uVar69 + 2;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar204 = *pfVar4;
  fVar207 = pfVar4[1];
  fVar209 = pfVar4[2];
  fVar212 = pfVar4[3];
  lVar3 = uVar69 + 3;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar3);
  fVar226 = *pfVar4;
  fVar227 = pfVar4[1];
  fVar228 = pfVar4[2];
  fVar100 = pfVar4[3];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar74);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar74);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar69);
  fVar154 = *pfVar4;
  fVar180 = pfVar4[1];
  fVar182 = pfVar4[2];
  fVar184 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar186 = *pfVar4;
  fVar205 = pfVar4[1];
  fVar208 = pfVar4[2];
  fVar210 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar102 = *pfVar4;
  fVar103 = pfVar4[1];
  fVar104 = pfVar4[2];
  fVar296 = pfVar4[3];
  fVar105 = fVar105 - auVar119._0_4_;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar152 = *pfVar4;
  fVar297 = pfVar4[1];
  fVar298 = pfVar4[2];
  fVar311 = pfVar4[3];
  fVar229 = auVar367._8_4_;
  fVar244 = auVar367._12_4_;
  auVar81._0_4_ = fVar179 * 0.0 + fVar204 * 0.5 + fVar226 * 0.0;
  auVar81._4_4_ = fVar181 * 0.0 + fVar207 * 0.5 + fVar227 * 0.0;
  auVar81._8_4_ = fVar229 * fVar183 + fVar209 * 0.5 + fVar228 * fVar229;
  auVar81._12_4_ = fVar244 * fVar185 + fVar212 * 0.5 + fVar100 * fVar244;
  auVar133._0_4_ = fVar77 * 0.5;
  auVar133._4_4_ = fVar99 * 0.5;
  auVar133._8_4_ = fVar101 * 0.5;
  auVar133._12_4_ = fVar153 * 0.5;
  auVar118 = vsubps_avx(auVar81,auVar133);
  auVar82._0_4_ = fVar186 * 0.0 + fVar102 * 0.5 + fVar152 * 0.0;
  auVar82._4_4_ = fVar205 * 0.0 + fVar103 * 0.5 + fVar297 * 0.0;
  auVar82._8_4_ = fVar208 * fVar229 + fVar104 * 0.5 + fVar298 * fVar229;
  auVar82._12_4_ = fVar210 * fVar244 + fVar296 * 0.5 + fVar311 * fVar244;
  auVar354._0_4_ = fVar154 * 0.5;
  auVar354._4_4_ = fVar180 * 0.5;
  auVar354._8_4_ = fVar182 * 0.5;
  auVar354._12_4_ = fVar184 * 0.5;
  auVar270 = vsubps_avx(auVar82,auVar354);
  local_5b8._0_4_ = fVar77 * -0.0 + fVar204 * 0.0 + fVar226 * -0.0 + fVar179;
  local_5b8._4_4_ = fVar99 * -0.0 + fVar207 * 0.0 + fVar227 * -0.0 + fVar181;
  fStack_5b0 = fVar101 * -0.0 + fVar229 * fVar209 + fVar228 * -0.0 + fVar183;
  fStack_5ac = fVar153 * -0.0 + fVar244 * fVar212 + fVar100 * -0.0 + fVar185;
  local_578._0_4_ = fVar77 * -0.0 + fVar179 * 0.0 + fVar204 + fVar226 * -0.0;
  local_578._4_4_ = fVar99 * -0.0 + fVar181 * 0.0 + fVar207 + fVar227 * -0.0;
  fStack_570 = fVar101 * -0.0 + fVar229 * fVar183 + fVar209 + fVar228 * -0.0;
  fStack_56c = fVar153 * -0.0 + fVar244 * fVar185 + fVar212 + fVar100 * -0.0;
  auVar265._0_4_ = fVar204 * 0.0 + fVar226 * 0.5;
  auVar265._4_4_ = fVar207 * 0.0 + fVar227 * 0.5;
  auVar265._8_4_ = fVar229 * fVar209 + fVar228 * 0.5;
  auVar265._12_4_ = fVar244 * fVar212 + fVar100 * 0.5;
  auVar189._0_4_ = fVar179 * 0.5;
  auVar189._4_4_ = fVar181 * 0.5;
  auVar189._8_4_ = fVar183 * 0.5;
  auVar189._12_4_ = fVar185 * 0.5;
  auVar119 = vsubps_avx(auVar265,auVar189);
  auVar360._0_4_ = fVar154 * -0.0 + fVar102 * 0.0 + fVar152 * -0.0 + fVar186;
  auVar360._4_4_ = fVar180 * -0.0 + fVar103 * 0.0 + fVar297 * -0.0 + fVar205;
  auVar360._8_4_ = fVar182 * -0.0 + fVar104 * 0.0 + fVar298 * -0.0 + fVar208;
  auVar360._12_4_ = fVar184 * -0.0 + fVar296 * 0.0 + fVar311 * -0.0 + fVar210;
  auVar285._0_4_ = fVar77 * 0.0 + auVar119._0_4_;
  auVar285._4_4_ = fVar99 * 0.0 + auVar119._4_4_;
  auVar285._8_4_ = fVar101 * 0.0 + auVar119._8_4_;
  auVar285._12_4_ = fVar153 * 0.0 + auVar119._12_4_;
  auVar157._0_4_ = fVar154 * -0.0 + fVar186 * 0.0 + fVar102 + fVar152 * -0.0;
  auVar157._4_4_ = fVar180 * -0.0 + fVar205 * 0.0 + fVar103 + fVar297 * -0.0;
  auVar157._8_4_ = fVar182 * -0.0 + fVar208 * fVar229 + fVar104 + fVar298 * -0.0;
  auVar157._12_4_ = fVar184 * -0.0 + fVar210 * fVar244 + fVar296 + fVar311 * -0.0;
  auVar190._0_4_ = fVar102 * 0.0 + fVar152 * 0.5;
  auVar190._4_4_ = fVar103 * 0.0 + fVar297 * 0.5;
  auVar190._8_4_ = fVar104 * 0.0 + fVar298 * 0.5;
  auVar190._12_4_ = fVar296 * 0.0 + fVar311 * 0.5;
  auVar255._0_4_ = fVar186 * 0.5;
  auVar255._4_4_ = fVar205 * 0.5;
  auVar255._8_4_ = fVar208 * 0.5;
  auVar255._12_4_ = fVar210 * 0.5;
  auVar119 = vsubps_avx(auVar190,auVar255);
  auVar191._0_4_ = fVar154 * 0.0 + auVar119._0_4_;
  auVar191._4_4_ = fVar180 * 0.0 + auVar119._4_4_;
  auVar191._8_4_ = fVar182 * 0.0 + auVar119._8_4_;
  auVar191._12_4_ = fVar184 * 0.0 + auVar119._12_4_;
  auVar119 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar193 = vshufps_avx(auVar360,auVar360,0xc9);
  fVar229 = auVar118._0_4_;
  auVar214._0_4_ = fVar229 * auVar193._0_4_;
  fVar244 = auVar118._4_4_;
  auVar214._4_4_ = fVar244 * auVar193._4_4_;
  fVar246 = auVar118._8_4_;
  auVar214._8_4_ = fVar246 * auVar193._8_4_;
  fVar247 = auVar118._12_4_;
  auVar214._12_4_ = fVar247 * auVar193._12_4_;
  auVar266._0_4_ = auVar360._0_4_ * auVar119._0_4_;
  auVar266._4_4_ = auVar360._4_4_ * auVar119._4_4_;
  auVar266._8_4_ = auVar360._8_4_ * auVar119._8_4_;
  auVar266._12_4_ = auVar360._12_4_ * auVar119._12_4_;
  auVar193 = vsubps_avx(auVar266,auVar214);
  auVar224 = vshufps_avx(auVar193,auVar193,0xc9);
  auVar193 = vshufps_avx(auVar270,auVar270,0xc9);
  auVar267._0_4_ = auVar193._0_4_ * fVar229;
  auVar267._4_4_ = auVar193._4_4_ * fVar244;
  auVar267._8_4_ = auVar193._8_4_ * fVar246;
  auVar267._12_4_ = auVar193._12_4_ * fVar247;
  auVar83._0_4_ = auVar119._0_4_ * auVar270._0_4_;
  auVar83._4_4_ = auVar119._4_4_ * auVar270._4_4_;
  auVar83._8_4_ = auVar119._8_4_ * auVar270._8_4_;
  auVar83._12_4_ = auVar119._12_4_ * auVar270._12_4_;
  auVar119 = vsubps_avx(auVar83,auVar267);
  auVar270 = vshufps_avx(auVar119,auVar119,0xc9);
  auVar193 = vshufps_avx(auVar285,auVar285,0xc9);
  auVar119 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar268._0_4_ = auVar285._0_4_ * auVar119._0_4_;
  auVar268._4_4_ = auVar285._4_4_ * auVar119._4_4_;
  auVar268._8_4_ = auVar285._8_4_ * auVar119._8_4_;
  auVar268._12_4_ = auVar285._12_4_ * auVar119._12_4_;
  auVar158._0_4_ = auVar193._0_4_ * auVar157._0_4_;
  auVar158._4_4_ = auVar193._4_4_ * auVar157._4_4_;
  auVar158._8_4_ = auVar193._8_4_ * auVar157._8_4_;
  auVar158._12_4_ = auVar193._12_4_ * auVar157._12_4_;
  auVar119 = vsubps_avx(auVar158,auVar268);
  auVar14 = vshufps_avx(auVar119,auVar119,0xc9);
  auVar119 = vshufps_avx(auVar191,auVar191,0xc9);
  auVar269._0_4_ = auVar285._0_4_ * auVar119._0_4_;
  auVar269._4_4_ = auVar285._4_4_ * auVar119._4_4_;
  auVar269._8_4_ = auVar285._8_4_ * auVar119._8_4_;
  auVar269._12_4_ = auVar285._12_4_ * auVar119._12_4_;
  auVar119 = vdpps_avx(auVar224,auVar224,0x7f);
  auVar192._0_4_ = auVar193._0_4_ * auVar191._0_4_;
  auVar192._4_4_ = auVar193._4_4_ * auVar191._4_4_;
  auVar192._8_4_ = auVar193._8_4_ * auVar191._8_4_;
  auVar192._12_4_ = auVar193._12_4_ * auVar191._12_4_;
  auVar193 = vsubps_avx(auVar192,auVar269);
  auVar138 = vshufps_avx(auVar193,auVar193,0xc9);
  fVar99 = auVar119._0_4_;
  auVar92 = ZEXT416((uint)fVar99);
  auVar193 = vrsqrtss_avx(auVar92,auVar92);
  fVar77 = auVar193._0_4_;
  auVar193 = ZEXT416((uint)(fVar77 * 1.5 - fVar99 * 0.5 * fVar77 * fVar77 * fVar77));
  auVar171 = vshufps_avx(auVar193,auVar193,0);
  auVar193 = vdpps_avx(auVar224,auVar270,0x7f);
  fVar186 = auVar171._0_4_ * auVar224._0_4_;
  fVar205 = auVar171._4_4_ * auVar224._4_4_;
  fVar208 = auVar171._8_4_ * auVar224._8_4_;
  fVar210 = auVar171._12_4_ * auVar224._12_4_;
  auVar119 = vshufps_avx(auVar119,auVar119,0);
  auVar84._0_4_ = auVar119._0_4_ * auVar270._0_4_;
  auVar84._4_4_ = auVar119._4_4_ * auVar270._4_4_;
  auVar84._8_4_ = auVar119._8_4_ * auVar270._8_4_;
  auVar84._12_4_ = auVar119._12_4_ * auVar270._12_4_;
  auVar119 = vshufps_avx(auVar193,auVar193,0);
  auVar215._0_4_ = auVar119._0_4_ * auVar224._0_4_;
  auVar215._4_4_ = auVar119._4_4_ * auVar224._4_4_;
  auVar215._8_4_ = auVar119._8_4_ * auVar224._8_4_;
  auVar215._12_4_ = auVar119._12_4_ * auVar224._12_4_;
  auVar170 = vsubps_avx(auVar84,auVar215);
  auVar119 = vrcpss_avx(auVar92,auVar92);
  auVar119 = ZEXT416((uint)(auVar119._0_4_ * (2.0 - fVar99 * auVar119._0_4_)));
  auVar224 = vshufps_avx(auVar119,auVar119,0);
  auVar119 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar102 = auVar119._0_4_;
  auVar270 = ZEXT416((uint)fVar102);
  auVar193 = vrsqrtss_avx(auVar270,auVar270);
  fVar154 = auVar193._0_4_;
  auVar193 = vdpps_avx(auVar14,auVar138,0x7f);
  auVar119 = vshufps_avx(auVar119,auVar119,0);
  auVar361._0_4_ = auVar138._0_4_ * auVar119._0_4_;
  auVar361._4_4_ = auVar138._4_4_ * auVar119._4_4_;
  auVar361._8_4_ = auVar138._8_4_ * auVar119._8_4_;
  auVar361._12_4_ = auVar138._12_4_ * auVar119._12_4_;
  lVar11 = *(long *)(_Var9 + 0x38 + lVar74);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar74);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar69);
  fVar77 = *pfVar4;
  fVar99 = pfVar4[1];
  fVar101 = pfVar4[2];
  fVar153 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar179 = *pfVar4;
  fVar181 = pfVar4[1];
  fVar183 = pfVar4[2];
  fVar185 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar204 = *pfVar4;
  fVar207 = pfVar4[1];
  fVar209 = pfVar4[2];
  fVar212 = pfVar4[3];
  auVar119 = vshufps_avx(auVar193,auVar193,0);
  auVar85._0_4_ = auVar119._0_4_ * auVar14._0_4_;
  auVar85._4_4_ = auVar119._4_4_ * auVar14._4_4_;
  auVar85._8_4_ = auVar119._8_4_ * auVar14._8_4_;
  auVar85._12_4_ = auVar119._12_4_ * auVar14._12_4_;
  auVar138 = vsubps_avx(auVar361,auVar85);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar226 = *pfVar4;
  fVar227 = pfVar4[1];
  fVar228 = pfVar4[2];
  fVar100 = pfVar4[3];
  lVar11 = *(long *)(lVar10 + 0x38 + lVar74);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar74);
  auVar119 = ZEXT416((uint)(fVar154 * 1.5 - fVar102 * 0.5 * fVar154 * fVar154 * fVar154));
  auVar193 = vshufps_avx(auVar119,auVar119,0);
  fVar154 = auVar193._0_4_ * auVar14._0_4_;
  fVar180 = auVar193._4_4_ * auVar14._4_4_;
  fVar182 = auVar193._8_4_ * auVar14._8_4_;
  fVar184 = auVar193._12_4_ * auVar14._12_4_;
  auVar119 = vrcpss_avx(auVar270,auVar270);
  auVar119 = ZEXT416((uint)(auVar119._0_4_ * (2.0 - auVar119._0_4_ * fVar102)));
  auVar119 = vshufps_avx(auVar119,auVar119,0);
  auVar270 = vshufps_avx(_local_5b8,_local_5b8,0xff);
  auVar327._0_4_ = auVar270._0_4_ * fVar186;
  auVar327._4_4_ = auVar270._4_4_ * fVar205;
  auVar327._8_4_ = auVar270._8_4_ * fVar208;
  auVar327._12_4_ = auVar270._12_4_ * fVar210;
  auVar14 = vshufps_avx(auVar118,auVar118,0xff);
  auVar92 = vsubps_avx(_local_5b8,auVar327);
  auVar256._0_4_ =
       auVar14._0_4_ * fVar186 + auVar270._0_4_ * auVar171._0_4_ * auVar170._0_4_ * auVar224._0_4_;
  auVar256._4_4_ =
       auVar14._4_4_ * fVar205 + auVar270._4_4_ * auVar171._4_4_ * auVar170._4_4_ * auVar224._4_4_;
  auVar256._8_4_ =
       auVar14._8_4_ * fVar208 + auVar270._8_4_ * auVar171._8_4_ * auVar170._8_4_ * auVar224._8_4_;
  auVar256._12_4_ =
       auVar14._12_4_ * fVar210 +
       auVar270._12_4_ * auVar171._12_4_ * auVar170._12_4_ * auVar224._12_4_;
  auVar118 = vsubps_avx(auVar118,auVar256);
  local_5b8._0_4_ = auVar327._0_4_ + (float)local_5b8._0_4_;
  local_5b8._4_4_ = auVar327._4_4_ + (float)local_5b8._4_4_;
  fStack_5b0 = auVar327._8_4_ + fStack_5b0;
  fStack_5ac = auVar327._12_4_ + fStack_5ac;
  auVar224 = vshufps_avx(_local_578,_local_578,0xff);
  auVar134._0_4_ = auVar224._0_4_ * fVar154;
  auVar134._4_4_ = auVar224._4_4_ * fVar180;
  auVar134._8_4_ = auVar224._8_4_ * fVar182;
  auVar134._12_4_ = auVar224._12_4_ * fVar184;
  auVar270 = vshufps_avx(auVar285,auVar285,0xff);
  auVar170 = vsubps_avx(_local_578,auVar134);
  auVar86._0_4_ =
       auVar270._0_4_ * fVar154 + auVar224._0_4_ * auVar193._0_4_ * auVar138._0_4_ * auVar119._0_4_;
  auVar86._4_4_ =
       auVar270._4_4_ * fVar180 + auVar224._4_4_ * auVar193._4_4_ * auVar138._4_4_ * auVar119._4_4_;
  auVar86._8_4_ =
       auVar270._8_4_ * fVar182 + auVar224._8_4_ * auVar193._8_4_ * auVar138._8_4_ * auVar119._8_4_;
  auVar86._12_4_ =
       auVar270._12_4_ * fVar184 +
       auVar224._12_4_ * auVar193._12_4_ * auVar138._12_4_ * auVar119._12_4_;
  auVar141 = vsubps_avx(auVar285,auVar86);
  local_578._0_4_ = (float)local_578._0_4_ + auVar134._0_4_;
  local_578._4_4_ = (float)local_578._4_4_ + auVar134._4_4_;
  fStack_570 = fStack_570 + auVar134._8_4_;
  fStack_56c = fStack_56c + auVar134._12_4_;
  auVar87._0_4_ = fVar179 * 0.0 + fVar204 * 0.5 + fVar226 * 0.0;
  auVar87._4_4_ = fVar181 * 0.0 + fVar207 * 0.5 + fVar227 * 0.0;
  auVar87._8_4_ = fVar183 * 0.0 + fVar209 * 0.5 + fVar228 * 0.0;
  auVar87._12_4_ = fVar185 * 0.0 + fVar212 * 0.5 + fVar100 * 0.0;
  auVar109._0_4_ = fVar77 * 0.5;
  auVar109._4_4_ = fVar99 * 0.5;
  auVar109._8_4_ = fVar101 * 0.5;
  auVar109._12_4_ = fVar153 * 0.5;
  auVar15 = vsubps_avx(auVar87,auVar109);
  pfVar4 = (float *)(lVar11 + lVar2 * lVar10);
  fVar154 = *pfVar4;
  fVar180 = pfVar4[1];
  fVar182 = pfVar4[2];
  fVar184 = pfVar4[3];
  auVar119 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar3);
  fVar152 = auVar119._0_4_;
  fVar297 = auVar119._4_4_;
  fVar298 = auVar119._8_4_;
  fVar311 = auVar119._12_4_;
  pfVar4 = (float *)(lVar11 + lVar1 * lVar10);
  fVar186 = *pfVar4;
  fVar205 = pfVar4[1];
  fVar208 = pfVar4[2];
  fVar210 = pfVar4[3];
  auVar233._0_4_ = fVar186 * 0.0 + fVar152 * 0.0 + fVar154 * 0.5;
  auVar233._4_4_ = fVar205 * 0.0 + fVar297 * 0.0 + fVar180 * 0.5;
  auVar233._8_4_ = fVar208 * 0.0 + fVar298 * 0.0 + fVar182 * 0.5;
  auVar233._12_4_ = fVar210 * 0.0 + fVar311 * 0.0 + fVar184 * 0.5;
  pfVar4 = (float *)(lVar11 + uVar69 * lVar10);
  fVar102 = *pfVar4;
  fVar103 = pfVar4[1];
  fVar104 = pfVar4[2];
  fVar296 = pfVar4[3];
  auVar271._0_4_ = fVar102 * 0.5;
  auVar271._4_4_ = fVar103 * 0.5;
  auVar271._8_4_ = fVar104 * 0.5;
  auVar271._12_4_ = fVar296 * 0.5;
  auVar193 = vsubps_avx(auVar233,auVar271);
  auVar272._0_4_ = fVar77 * -0.0 + fVar179 + fVar204 * 0.0 + fVar226 * -0.0;
  auVar272._4_4_ = fVar99 * -0.0 + fVar181 + fVar207 * 0.0 + fVar227 * -0.0;
  auVar272._8_4_ = fVar101 * -0.0 + fVar183 + fVar209 * 0.0 + fVar228 * -0.0;
  auVar272._12_4_ = fVar153 * -0.0 + fVar185 + fVar212 * 0.0 + fVar100 * -0.0;
  auVar257._0_4_ = fVar77 * -0.0 + fVar179 * 0.0 + fVar204 + fVar226 * -0.0;
  auVar257._4_4_ = fVar99 * -0.0 + fVar181 * 0.0 + fVar207 + fVar227 * -0.0;
  auVar257._8_4_ = fVar101 * -0.0 + fVar183 * 0.0 + fVar209 + fVar228 * -0.0;
  auVar257._12_4_ = fVar153 * -0.0 + fVar185 * 0.0 + fVar212 + fVar100 * -0.0;
  auVar300._0_4_ = fVar204 * 0.0 + fVar226 * 0.5;
  auVar300._4_4_ = fVar207 * 0.0 + fVar227 * 0.5;
  auVar300._8_4_ = fVar209 * 0.0 + fVar228 * 0.5;
  auVar300._12_4_ = fVar212 * 0.0 + fVar100 * 0.5;
  auVar328._0_4_ = fVar179 * 0.5;
  auVar328._4_4_ = fVar181 * 0.5;
  auVar328._8_4_ = fVar183 * 0.5;
  auVar328._12_4_ = fVar185 * 0.5;
  auVar119 = vsubps_avx(auVar300,auVar328);
  auVar313._0_4_ = fVar77 * 0.0 + auVar119._0_4_;
  auVar313._4_4_ = fVar99 * 0.0 + auVar119._4_4_;
  auVar313._8_4_ = fVar101 * 0.0 + auVar119._8_4_;
  auVar313._12_4_ = fVar153 * 0.0 + auVar119._12_4_;
  auVar301._0_4_ = fVar102 * -0.0 + fVar186 + fVar152 * -0.0 + fVar154 * 0.0;
  auVar301._4_4_ = fVar103 * -0.0 + fVar205 + fVar297 * -0.0 + fVar180 * 0.0;
  auVar301._8_4_ = fVar104 * -0.0 + fVar208 + fVar298 * -0.0 + fVar182 * 0.0;
  auVar301._12_4_ = fVar296 * -0.0 + fVar210 + fVar311 * -0.0 + fVar184 * 0.0;
  auVar110._0_4_ = fVar102 * -0.0 + fVar152 * -0.0 + fVar154 + fVar186 * 0.0;
  auVar110._4_4_ = fVar103 * -0.0 + fVar297 * -0.0 + fVar180 + fVar205 * 0.0;
  auVar110._8_4_ = fVar104 * -0.0 + fVar298 * -0.0 + fVar182 + fVar208 * 0.0;
  auVar110._12_4_ = fVar296 * -0.0 + fVar311 * -0.0 + fVar184 + fVar210 * 0.0;
  auVar135._0_4_ = fVar154 * 0.0 + fVar152 * 0.5;
  auVar135._4_4_ = fVar180 * 0.0 + fVar297 * 0.5;
  auVar135._8_4_ = fVar182 * 0.0 + fVar298 * 0.5;
  auVar135._12_4_ = fVar184 * 0.0 + fVar311 * 0.5;
  auVar159._0_4_ = fVar186 * 0.5;
  auVar159._4_4_ = fVar205 * 0.5;
  auVar159._8_4_ = fVar208 * 0.5;
  auVar159._12_4_ = fVar210 * 0.5;
  auVar119 = vsubps_avx(auVar135,auVar159);
  auVar136._0_4_ = fVar102 * 0.0 + auVar119._0_4_;
  auVar136._4_4_ = fVar103 * 0.0 + auVar119._4_4_;
  auVar136._8_4_ = fVar104 * 0.0 + auVar119._8_4_;
  auVar136._12_4_ = fVar296 * 0.0 + auVar119._12_4_;
  auVar119 = vshufps_avx(auVar301,auVar301,0xc9);
  fVar204 = auVar15._0_4_;
  auVar88._0_4_ = fVar204 * auVar119._0_4_;
  fVar207 = auVar15._4_4_;
  auVar88._4_4_ = fVar207 * auVar119._4_4_;
  fVar209 = auVar15._8_4_;
  auVar88._8_4_ = fVar209 * auVar119._8_4_;
  fVar227 = auVar15._12_4_;
  auVar88._12_4_ = fVar227 * auVar119._12_4_;
  auVar119 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar302._0_4_ = auVar301._0_4_ * auVar119._0_4_;
  auVar302._4_4_ = auVar301._4_4_ * auVar119._4_4_;
  auVar302._8_4_ = auVar301._8_4_ * auVar119._8_4_;
  auVar302._12_4_ = auVar301._12_4_ * auVar119._12_4_;
  auVar224 = vsubps_avx(auVar302,auVar88);
  auVar160._0_4_ = auVar119._0_4_ * auVar193._0_4_;
  auVar160._4_4_ = auVar119._4_4_ * auVar193._4_4_;
  auVar160._8_4_ = auVar119._8_4_ * auVar193._8_4_;
  auVar160._12_4_ = auVar119._12_4_ * auVar193._12_4_;
  auVar119 = vshufps_avx(auVar193,auVar193,0xc9);
  auVar234._0_4_ = fVar204 * auVar119._0_4_;
  auVar234._4_4_ = fVar207 * auVar119._4_4_;
  auVar234._8_4_ = fVar209 * auVar119._8_4_;
  auVar234._12_4_ = fVar227 * auVar119._12_4_;
  auVar270 = vsubps_avx(auVar160,auVar234);
  auVar119 = vshufps_avx(auVar110,auVar110,0xc9);
  auVar235._0_4_ = auVar313._0_4_ * auVar119._0_4_;
  auVar235._4_4_ = auVar313._4_4_ * auVar119._4_4_;
  auVar235._8_4_ = auVar313._8_4_ * auVar119._8_4_;
  auVar235._12_4_ = auVar313._12_4_ * auVar119._12_4_;
  auVar119 = vshufps_avx(auVar313,auVar313,0xc9);
  auVar111._0_4_ = auVar119._0_4_ * auVar110._0_4_;
  auVar111._4_4_ = auVar119._4_4_ * auVar110._4_4_;
  auVar111._8_4_ = auVar119._8_4_ * auVar110._8_4_;
  auVar111._12_4_ = auVar119._12_4_ * auVar110._12_4_;
  auVar14 = vsubps_avx(auVar111,auVar235);
  auVar224 = vshufps_avx(auVar224,auVar224,0xc9);
  auVar236._0_4_ = auVar119._0_4_ * auVar136._0_4_;
  auVar236._4_4_ = auVar119._4_4_ * auVar136._4_4_;
  auVar236._8_4_ = auVar119._8_4_ * auVar136._8_4_;
  auVar236._12_4_ = auVar119._12_4_ * auVar136._12_4_;
  auVar119 = vshufps_avx(auVar136,auVar136,0xc9);
  auVar137._0_4_ = auVar313._0_4_ * auVar119._0_4_;
  auVar137._4_4_ = auVar313._4_4_ * auVar119._4_4_;
  auVar137._8_4_ = auVar313._8_4_ * auVar119._8_4_;
  auVar137._12_4_ = auVar313._12_4_ * auVar119._12_4_;
  auVar119 = vdpps_avx(auVar224,auVar224,0x7f);
  auVar171 = vsubps_avx(auVar236,auVar137);
  fVar99 = auVar119._0_4_;
  auVar138 = ZEXT416((uint)fVar99);
  auVar193 = vrsqrtss_avx(auVar138,auVar138);
  fVar77 = auVar193._0_4_;
  auVar193 = vshufps_avx(auVar270,auVar270,0xc9);
  auVar119 = vshufps_avx(auVar119,auVar119,0);
  auVar329._0_4_ = auVar119._0_4_ * auVar193._0_4_;
  auVar329._4_4_ = auVar119._4_4_ * auVar193._4_4_;
  auVar329._8_4_ = auVar119._8_4_ * auVar193._8_4_;
  auVar329._12_4_ = auVar119._12_4_ * auVar193._12_4_;
  auVar119 = vdpps_avx(auVar224,auVar193,0x7f);
  auVar119 = vshufps_avx(auVar119,auVar119,0);
  auVar161._0_4_ = auVar119._0_4_ * auVar224._0_4_;
  auVar161._4_4_ = auVar119._4_4_ * auVar224._4_4_;
  auVar161._8_4_ = auVar119._8_4_ * auVar224._8_4_;
  auVar161._12_4_ = auVar119._12_4_ * auVar224._12_4_;
  auVar78 = vsubps_avx(auVar329,auVar161);
  auVar119 = vrcpss_avx(auVar138,auVar138);
  auVar119 = ZEXT416((uint)((2.0 - fVar99 * auVar119._0_4_) * auVar119._0_4_));
  auVar270 = vshufps_avx(auVar119,auVar119,0);
  auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar119 = ZEXT416((uint)(fVar77 * 1.5 - fVar99 * 0.5 * fVar77 * fVar77 * fVar77));
  auVar138 = vshufps_avx(auVar119,auVar119,0);
  fVar77 = auVar224._0_4_ * auVar138._0_4_;
  fVar99 = auVar224._4_4_ * auVar138._4_4_;
  fVar101 = auVar224._8_4_ * auVar138._8_4_;
  fVar153 = auVar224._12_4_ * auVar138._12_4_;
  auVar193 = vdpps_avx(auVar14,auVar14,0x7f);
  auVar119 = vblendps_avx(auVar193,_DAT_01feba10,0xe);
  auVar224 = vrsqrtss_avx(auVar119,auVar119);
  fVar179 = auVar224._0_4_;
  auVar224 = vshufps_avx(auVar171,auVar171,0xc9);
  auVar171 = vshufps_avx(auVar193,auVar193,0);
  auVar344._0_4_ = auVar171._0_4_ * auVar224._0_4_;
  auVar344._4_4_ = auVar171._4_4_ * auVar224._4_4_;
  auVar344._8_4_ = auVar171._8_4_ * auVar224._8_4_;
  auVar344._12_4_ = auVar171._12_4_ * auVar224._12_4_;
  auVar224 = vdpps_avx(auVar14,auVar224,0x7f);
  auVar224 = vshufps_avx(auVar224,auVar224,0);
  auVar330._0_4_ = auVar224._0_4_ * auVar14._0_4_;
  auVar330._4_4_ = auVar224._4_4_ * auVar14._4_4_;
  auVar330._8_4_ = auVar224._8_4_ * auVar14._8_4_;
  auVar330._12_4_ = auVar224._12_4_ * auVar14._12_4_;
  auVar171 = vsubps_avx(auVar344,auVar330);
  auVar119 = vrcpss_avx(auVar119,auVar119);
  auVar119 = ZEXT416((uint)(auVar119._0_4_ * (2.0 - auVar193._0_4_ * auVar119._0_4_)));
  auVar119 = vshufps_avx(auVar119,auVar119,0);
  auVar193 = ZEXT416((uint)(fVar179 * 1.5 - auVar193._0_4_ * 0.5 * fVar179 * fVar179 * fVar179));
  auVar193 = vshufps_avx(auVar193,auVar193,0);
  fVar179 = auVar14._0_4_ * auVar193._0_4_;
  fVar181 = auVar14._4_4_ * auVar193._4_4_;
  fVar183 = auVar14._8_4_ * auVar193._8_4_;
  fVar185 = auVar14._12_4_ * auVar193._12_4_;
  auVar224 = vshufps_avx(auVar15,auVar15,0xff);
  auVar14 = vshufps_avx(auVar272,auVar272,0xff);
  auVar89._0_4_ = auVar14._0_4_ * fVar77;
  auVar89._4_4_ = auVar14._4_4_ * fVar99;
  auVar89._8_4_ = auVar14._8_4_ * fVar101;
  auVar89._12_4_ = auVar14._12_4_ * fVar153;
  auVar112._0_4_ =
       auVar224._0_4_ * fVar77 + auVar14._0_4_ * auVar138._0_4_ * auVar78._0_4_ * auVar270._0_4_;
  auVar112._4_4_ =
       auVar224._4_4_ * fVar99 + auVar14._4_4_ * auVar138._4_4_ * auVar78._4_4_ * auVar270._4_4_;
  auVar112._8_4_ =
       auVar224._8_4_ * fVar101 + auVar14._8_4_ * auVar138._8_4_ * auVar78._8_4_ * auVar270._8_4_;
  auVar112._12_4_ =
       auVar224._12_4_ * fVar153 +
       auVar14._12_4_ * auVar138._12_4_ * auVar78._12_4_ * auVar270._12_4_;
  auVar14 = vsubps_avx(auVar272,auVar89);
  auVar138 = vsubps_avx(auVar15,auVar112);
  auVar224 = vshufps_avx(auVar313,auVar313,0xff);
  auVar270 = vshufps_avx(auVar257,auVar257,0xff);
  auVar162._0_4_ = auVar270._0_4_ * fVar179;
  auVar162._4_4_ = auVar270._4_4_ * fVar181;
  auVar162._8_4_ = auVar270._8_4_ * fVar183;
  auVar162._12_4_ = auVar270._12_4_ * fVar185;
  auVar113._0_4_ =
       auVar224._0_4_ * fVar179 + auVar270._0_4_ * auVar193._0_4_ * auVar171._0_4_ * auVar119._0_4_;
  auVar113._4_4_ =
       auVar224._4_4_ * fVar181 + auVar270._4_4_ * auVar193._4_4_ * auVar171._4_4_ * auVar119._4_4_;
  auVar113._8_4_ =
       auVar224._8_4_ * fVar183 + auVar270._8_4_ * auVar193._8_4_ * auVar171._8_4_ * auVar119._8_4_;
  auVar113._12_4_ =
       auVar224._12_4_ * fVar185 +
       auVar270._12_4_ * auVar193._12_4_ * auVar171._12_4_ * auVar119._12_4_;
  auVar224 = vsubps_avx(auVar257,auVar162);
  auVar345._0_4_ = auVar257._0_4_ + auVar162._0_4_;
  auVar345._4_4_ = auVar257._4_4_ + auVar162._4_4_;
  auVar345._8_4_ = auVar257._8_4_ + auVar162._8_4_;
  auVar345._12_4_ = auVar257._12_4_ + auVar162._12_4_;
  auVar270 = vsubps_avx(auVar313,auVar113);
  local_458 = auVar118._0_4_;
  fStack_454 = auVar118._4_4_;
  fStack_450 = auVar118._8_4_;
  fStack_44c = auVar118._12_4_;
  local_558 = auVar92._0_4_;
  fStack_554 = auVar92._4_4_;
  fStack_550 = auVar92._8_4_;
  fStack_54c = auVar92._12_4_;
  auVar119 = vshufps_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105),0);
  auVar193 = vshufps_avx(ZEXT416((uint)(1.0 - fVar105)),ZEXT416((uint)(1.0 - fVar105)),0);
  fVar153 = auVar119._0_4_;
  fVar179 = auVar119._4_4_;
  fVar181 = auVar119._8_4_;
  fVar183 = auVar119._12_4_;
  fVar105 = auVar193._0_4_;
  fVar77 = auVar193._4_4_;
  fVar99 = auVar193._8_4_;
  fVar101 = auVar193._12_4_;
  local_3c8._0_4_ = fVar105 * local_558 + fVar153 * auVar14._0_4_;
  local_3c8._4_4_ = fVar77 * fStack_554 + fVar179 * auVar14._4_4_;
  fStack_3c0 = fVar99 * fStack_550 + fVar181 * auVar14._8_4_;
  fStack_3bc = fVar101 * fStack_54c + fVar183 * auVar14._12_4_;
  fVar212 = fVar105 * (local_558 + local_458 * 0.33333334) +
            fVar153 * (auVar14._0_4_ + auVar138._0_4_ * 0.33333334);
  fVar100 = fVar77 * (fStack_554 + fStack_454 * 0.33333334) +
            fVar179 * (auVar14._4_4_ + auVar138._4_4_ * 0.33333334);
  fVar184 = fVar99 * (fStack_550 + fStack_450 * 0.33333334) +
            fVar181 * (auVar14._8_4_ + auVar138._8_4_ * 0.33333334);
  fVar210 = fVar101 * (fStack_54c + fStack_44c * 0.33333334) +
            fVar183 * (auVar14._12_4_ + auVar138._12_4_ * 0.33333334);
  local_518 = auVar141._0_4_;
  fStack_514 = auVar141._4_4_;
  fStack_510 = auVar141._8_4_;
  fStack_50c = auVar141._12_4_;
  auVar163._0_4_ = local_518 * 0.33333334;
  auVar163._4_4_ = fStack_514 * 0.33333334;
  auVar163._8_4_ = fStack_510 * 0.33333334;
  auVar163._12_4_ = fStack_50c * 0.33333334;
  auVar119 = vsubps_avx(auVar170,auVar163);
  auVar237._0_4_ = (auVar285._0_4_ + auVar86._0_4_) * 0.33333334;
  auVar237._4_4_ = (auVar285._4_4_ + auVar86._4_4_) * 0.33333334;
  auVar237._8_4_ = (auVar285._8_4_ + auVar86._8_4_) * 0.33333334;
  auVar237._12_4_ = (auVar285._12_4_ + auVar86._12_4_) * 0.33333334;
  auVar193 = vsubps_avx(_local_578,auVar237);
  auVar139._0_4_ = auVar270._0_4_ * 0.33333334;
  auVar139._4_4_ = auVar270._4_4_ * 0.33333334;
  auVar139._8_4_ = auVar270._8_4_ * 0.33333334;
  auVar139._12_4_ = auVar270._12_4_ * 0.33333334;
  auVar270 = vsubps_avx(auVar224,auVar139);
  auVar303._0_4_ = (auVar313._0_4_ + auVar113._0_4_) * 0.33333334;
  auVar303._4_4_ = (auVar313._4_4_ + auVar113._4_4_) * 0.33333334;
  auVar303._8_4_ = (auVar313._8_4_ + auVar113._8_4_) * 0.33333334;
  auVar303._12_4_ = (auVar313._12_4_ + auVar113._12_4_) * 0.33333334;
  auVar14 = vsubps_avx(auVar345,auVar303);
  local_3d8._0_4_ = fVar105 * auVar119._0_4_ + fVar153 * auVar270._0_4_;
  local_3d8._4_4_ = fVar77 * auVar119._4_4_ + fVar179 * auVar270._4_4_;
  fStack_3d0 = fVar99 * auVar119._8_4_ + fVar181 * auVar270._8_4_;
  fStack_3cc = fVar101 * auVar119._12_4_ + fVar183 * auVar270._12_4_;
  fVar226 = fVar153 * auVar224._0_4_ + fVar105 * auVar170._0_4_;
  fVar154 = fVar179 * auVar224._4_4_ + fVar77 * auVar170._4_4_;
  fVar186 = fVar181 * auVar224._8_4_ + fVar99 * auVar170._8_4_;
  fVar102 = fVar183 * auVar224._12_4_ + fVar101 * auVar170._12_4_;
  local_3e8._0_4_ = (float)local_5b8._0_4_ * fVar105 + fVar153 * (auVar272._0_4_ + auVar89._0_4_);
  local_3e8._4_4_ = (float)local_5b8._4_4_ * fVar77 + fVar179 * (auVar272._4_4_ + auVar89._4_4_);
  fStack_3e0 = fStack_5b0 * fVar99 + fVar181 * (auVar272._8_4_ + auVar89._8_4_);
  fStack_3dc = fStack_5ac * fVar101 + fVar183 * (auVar272._12_4_ + auVar89._12_4_);
  local_3f8._0_4_ =
       fVar105 * ((float)local_5b8._0_4_ + (fVar229 + auVar256._0_4_) * 0.33333334) +
       fVar153 * (auVar272._0_4_ + auVar89._0_4_ + (fVar204 + auVar112._0_4_) * 0.33333334);
  local_3f8._4_4_ =
       fVar77 * ((float)local_5b8._4_4_ + (fVar244 + auVar256._4_4_) * 0.33333334) +
       fVar179 * (auVar272._4_4_ + auVar89._4_4_ + (fVar207 + auVar112._4_4_) * 0.33333334);
  fStack_3f0 = fVar99 * (fStack_5b0 + (fVar246 + auVar256._8_4_) * 0.33333334) +
               fVar181 * (auVar272._8_4_ + auVar89._8_4_ + (fVar209 + auVar112._8_4_) * 0.33333334);
  fStack_3ec = fVar101 * (fStack_5ac + (fVar247 + auVar256._12_4_) * 0.33333334) +
               fVar183 * (auVar272._12_4_ + auVar89._12_4_ +
                         (fVar227 + auVar112._12_4_) * 0.33333334);
  fVar227 = fVar105 * auVar193._0_4_ + fVar153 * auVar14._0_4_;
  fVar180 = fVar77 * auVar193._4_4_ + fVar179 * auVar14._4_4_;
  fVar205 = fVar99 * auVar193._8_4_ + fVar181 * auVar14._8_4_;
  fVar103 = fVar101 * auVar193._12_4_ + fVar183 * auVar14._12_4_;
  fVar228 = (float)local_578._0_4_ * fVar105 + fVar153 * auVar345._0_4_;
  fVar182 = (float)local_578._4_4_ * fVar77 + fVar179 * auVar345._4_4_;
  fVar208 = fStack_570 * fVar99 + fVar181 * auVar345._8_4_;
  fVar104 = fStack_56c * fVar101 + fVar183 * auVar345._12_4_;
  auVar119 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar119 = vinsertps_avx(auVar119,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_268 = vsubps_avx(_local_3c8,auVar119);
  auVar224 = vmovsldup_avx(local_268);
  auVar193 = vmovshdup_avx(local_268);
  auVar270 = vshufps_avx(local_268,local_268,0xaa);
  fVar105 = (pLVar75->vx).field_0.m128[0];
  fVar77 = (pLVar75->vx).field_0.m128[1];
  fVar99 = (pLVar75->vx).field_0.m128[2];
  fVar101 = (pLVar75->vx).field_0.m128[3];
  fVar153 = (pLVar75->vy).field_0.m128[0];
  fVar179 = (pLVar75->vy).field_0.m128[1];
  fVar181 = (pLVar75->vy).field_0.m128[2];
  fVar183 = (pLVar75->vy).field_0.m128[3];
  fVar185 = (pLVar75->vz).field_0.m128[0];
  fVar204 = (pLVar75->vz).field_0.m128[1];
  fVar207 = (pLVar75->vz).field_0.m128[2];
  fVar209 = (pLVar75->vz).field_0.m128[3];
  auVar331._0_4_ = fVar105 * auVar224._0_4_ + fVar153 * auVar193._0_4_ + fVar185 * auVar270._0_4_;
  auVar331._4_4_ = fVar77 * auVar224._4_4_ + fVar179 * auVar193._4_4_ + fVar204 * auVar270._4_4_;
  auVar331._8_4_ = fVar99 * auVar224._8_4_ + fVar181 * auVar193._8_4_ + fVar207 * auVar270._8_4_;
  auVar331._12_4_ =
       fVar101 * auVar224._12_4_ + fVar183 * auVar193._12_4_ + fVar209 * auVar270._12_4_;
  auVar61._4_4_ = fVar100;
  auVar61._0_4_ = fVar212;
  auVar61._8_4_ = fVar184;
  auVar61._12_4_ = fVar210;
  local_278 = vsubps_avx(auVar61,auVar119);
  auVar270 = vshufps_avx(local_278,local_278,0xaa);
  auVar193 = vmovshdup_avx(local_278);
  auVar224 = vmovsldup_avx(local_278);
  auVar346._0_8_ =
       CONCAT44(fVar77 * auVar224._4_4_ + fVar179 * auVar193._4_4_ + fVar204 * auVar270._4_4_,
                fVar105 * auVar224._0_4_ + fVar153 * auVar193._0_4_ + fVar185 * auVar270._0_4_);
  auVar346._8_4_ = fVar99 * auVar224._8_4_ + fVar181 * auVar193._8_4_ + fVar207 * auVar270._8_4_;
  auVar346._12_4_ =
       fVar101 * auVar224._12_4_ + fVar183 * auVar193._12_4_ + fVar209 * auVar270._12_4_;
  local_288 = vsubps_avx(_local_3d8,auVar119);
  auVar270 = vshufps_avx(local_288,local_288,0xaa);
  auVar193 = vmovshdup_avx(local_288);
  auVar224 = vmovsldup_avx(local_288);
  auVar362._0_4_ = fVar105 * auVar224._0_4_ + fVar153 * auVar193._0_4_ + fVar185 * auVar270._0_4_;
  auVar362._4_4_ = fVar77 * auVar224._4_4_ + fVar179 * auVar193._4_4_ + fVar204 * auVar270._4_4_;
  auVar362._8_4_ = fVar99 * auVar224._8_4_ + fVar181 * auVar193._8_4_ + fVar207 * auVar270._8_4_;
  auVar362._12_4_ =
       fVar101 * auVar224._12_4_ + fVar183 * auVar193._12_4_ + fVar209 * auVar270._12_4_;
  auVar59._4_4_ = fVar154;
  auVar59._0_4_ = fVar226;
  auVar59._8_4_ = fVar186;
  auVar59._12_4_ = fVar102;
  local_298 = vsubps_avx(auVar59,auVar119);
  auVar270 = vshufps_avx(local_298,local_298,0xaa);
  auVar193 = vmovshdup_avx(local_298);
  auVar224 = vmovsldup_avx(local_298);
  auVar258._0_4_ = auVar224._0_4_ * fVar105 + auVar193._0_4_ * fVar153 + fVar185 * auVar270._0_4_;
  auVar258._4_4_ = auVar224._4_4_ * fVar77 + auVar193._4_4_ * fVar179 + fVar204 * auVar270._4_4_;
  auVar258._8_4_ = auVar224._8_4_ * fVar99 + auVar193._8_4_ * fVar181 + fVar207 * auVar270._8_4_;
  auVar258._12_4_ =
       auVar224._12_4_ * fVar101 + auVar193._12_4_ * fVar183 + fVar209 * auVar270._12_4_;
  local_2a8 = vsubps_avx(_local_3e8,auVar119);
  auVar270 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar193 = vmovshdup_avx(local_2a8);
  auVar224 = vmovsldup_avx(local_2a8);
  auVar273._0_4_ = auVar224._0_4_ * fVar105 + auVar193._0_4_ * fVar153 + auVar270._0_4_ * fVar185;
  auVar273._4_4_ = auVar224._4_4_ * fVar77 + auVar193._4_4_ * fVar179 + auVar270._4_4_ * fVar204;
  auVar273._8_4_ = auVar224._8_4_ * fVar99 + auVar193._8_4_ * fVar181 + auVar270._8_4_ * fVar207;
  auVar273._12_4_ =
       auVar224._12_4_ * fVar101 + auVar193._12_4_ * fVar183 + auVar270._12_4_ * fVar209;
  local_2b8 = vsubps_avx(_local_3f8,auVar119);
  auVar270 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar193 = vmovshdup_avx(local_2b8);
  auVar224 = vmovsldup_avx(local_2b8);
  auVar286._0_4_ = auVar224._0_4_ * fVar105 + auVar193._0_4_ * fVar153 + auVar270._0_4_ * fVar185;
  auVar286._4_4_ = auVar224._4_4_ * fVar77 + auVar193._4_4_ * fVar179 + auVar270._4_4_ * fVar204;
  auVar286._8_4_ = auVar224._8_4_ * fVar99 + auVar193._8_4_ * fVar181 + auVar270._8_4_ * fVar207;
  auVar286._12_4_ =
       auVar224._12_4_ * fVar101 + auVar193._12_4_ * fVar183 + auVar270._12_4_ * fVar209;
  auVar57._4_4_ = fVar180;
  auVar57._0_4_ = fVar227;
  auVar57._8_4_ = fVar205;
  auVar57._12_4_ = fVar103;
  local_2c8 = vsubps_avx(auVar57,auVar119);
  auVar270 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar193 = vmovshdup_avx(local_2c8);
  auVar224 = vmovsldup_avx(local_2c8);
  auVar304._0_4_ = auVar224._0_4_ * fVar105 + auVar193._0_4_ * fVar153 + auVar270._0_4_ * fVar185;
  auVar304._4_4_ = auVar224._4_4_ * fVar77 + auVar193._4_4_ * fVar179 + auVar270._4_4_ * fVar204;
  auVar304._8_4_ = auVar224._8_4_ * fVar99 + auVar193._8_4_ * fVar181 + auVar270._8_4_ * fVar207;
  auVar304._12_4_ =
       auVar224._12_4_ * fVar101 + auVar193._12_4_ * fVar183 + auVar270._12_4_ * fVar209;
  auVar55._4_4_ = fVar182;
  auVar55._0_4_ = fVar228;
  auVar55._8_4_ = fVar208;
  auVar55._12_4_ = fVar104;
  local_2d8 = vsubps_avx(auVar55,auVar119);
  auVar224 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar119 = vmovshdup_avx(local_2d8);
  auVar193 = vmovsldup_avx(local_2d8);
  auVar90._0_4_ = fVar105 * auVar193._0_4_ + fVar153 * auVar119._0_4_ + fVar185 * auVar224._0_4_;
  auVar90._4_4_ = fVar77 * auVar193._4_4_ + fVar179 * auVar119._4_4_ + fVar204 * auVar224._4_4_;
  auVar90._8_4_ = fVar99 * auVar193._8_4_ + fVar181 * auVar119._8_4_ + fVar207 * auVar224._8_4_;
  auVar90._12_4_ = fVar101 * auVar193._12_4_ + fVar183 * auVar119._12_4_ + fVar209 * auVar224._12_4_
  ;
  auVar270 = vmovlhps_avx(auVar331,auVar273);
  auVar14 = vmovlhps_avx(auVar346,auVar286);
  auVar138 = vmovlhps_avx(auVar362,auVar304);
  _local_3b8 = vmovlhps_avx(auVar258,auVar90);
  auVar119 = vminps_avx(auVar270,auVar14);
  auVar193 = vminps_avx(auVar138,_local_3b8);
  auVar224 = vminps_avx(auVar119,auVar193);
  auVar119 = vmaxps_avx(auVar270,auVar14);
  auVar193 = vmaxps_avx(auVar138,_local_3b8);
  auVar119 = vmaxps_avx(auVar119,auVar193);
  auVar193 = vshufpd_avx(auVar224,auVar224,3);
  auVar224 = vminps_avx(auVar224,auVar193);
  auVar193 = vshufpd_avx(auVar119,auVar119,3);
  auVar193 = vmaxps_avx(auVar119,auVar193);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar119 = vandps_avx(auVar224,auVar238);
  auVar193 = vandps_avx(auVar193,auVar238);
  auVar119 = vmaxps_avx(auVar119,auVar193);
  auVar193 = vmovshdup_avx(auVar119);
  auVar119 = vmaxss_avx(auVar193,auVar119);
  fVar77 = auVar119._0_4_ * 9.536743e-07;
  register0x00001548 = auVar346._0_8_;
  local_3a8 = auVar346._0_8_;
  auVar119 = vshufps_avx(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77),0);
  local_138._16_16_ = auVar119;
  local_138._0_16_ = auVar119;
  auVar91._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
  auVar91._8_4_ = auVar119._8_4_ ^ 0x80000000;
  auVar91._12_4_ = auVar119._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar91;
  local_158._0_16_ = auVar91;
  local_308 = vpshufd_avx(ZEXT416(*(uint *)(local_408 + 2)),0);
  local_318 = vpshufd_avx(ZEXT416(*(uint *)(local_408 + lVar70 * 4 + 6)),0);
  bVar65 = false;
  uVar69 = 0;
  fVar105 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar14,auVar270);
  _local_248 = vsubps_avx(auVar138,auVar14);
  _local_258 = vsubps_avx(_local_3b8,auVar138);
  _local_328 = vsubps_avx(_local_3e8,_local_3c8);
  auVar62._4_4_ = fVar100;
  auVar62._0_4_ = fVar212;
  auVar62._8_4_ = fVar184;
  auVar62._12_4_ = fVar210;
  _local_338 = vsubps_avx(_local_3f8,auVar62);
  auVar58._4_4_ = fVar180;
  auVar58._0_4_ = fVar227;
  auVar58._8_4_ = fVar205;
  auVar58._12_4_ = fVar103;
  _local_348 = vsubps_avx(auVar58,_local_3d8);
  auVar56._4_4_ = fVar182;
  auVar56._0_4_ = fVar228;
  auVar56._8_4_ = fVar208;
  auVar56._12_4_ = fVar104;
  auVar60._4_4_ = fVar154;
  auVar60._0_4_ = fVar226;
  auVar60._8_4_ = fVar186;
  auVar60._12_4_ = fVar102;
  _local_358 = vsubps_avx(auVar56,auVar60);
  _local_5b8 = ZEXT816(0x3f80000000000000);
  local_2e8 = _local_5b8;
  do {
    auVar119 = vshufps_avx(_local_5b8,_local_5b8,0x50);
    auVar363._8_4_ = 0x3f800000;
    auVar363._0_8_ = &DAT_3f8000003f800000;
    auVar363._12_4_ = 0x3f800000;
    auVar366._16_4_ = 0x3f800000;
    auVar366._0_16_ = auVar363;
    auVar366._20_4_ = 0x3f800000;
    auVar366._24_4_ = 0x3f800000;
    auVar366._28_4_ = 0x3f800000;
    auVar193 = vsubps_avx(auVar363,auVar119);
    fVar99 = auVar119._0_4_;
    fVar101 = auVar119._4_4_;
    fVar153 = auVar119._8_4_;
    fVar179 = auVar119._12_4_;
    fVar181 = auVar193._0_4_;
    fVar183 = auVar193._4_4_;
    fVar185 = auVar193._8_4_;
    fVar204 = auVar193._12_4_;
    auVar140._0_4_ = auVar273._0_4_ * fVar99 + fVar181 * auVar331._0_4_;
    auVar140._4_4_ = auVar273._4_4_ * fVar101 + fVar183 * auVar331._4_4_;
    auVar140._8_4_ = auVar273._0_4_ * fVar153 + fVar185 * auVar331._0_4_;
    auVar140._12_4_ = auVar273._4_4_ * fVar179 + fVar204 * auVar331._4_4_;
    auVar114._0_4_ = auVar286._0_4_ * fVar99 + local_3a8._0_4_ * fVar181;
    auVar114._4_4_ = auVar286._4_4_ * fVar101 + local_3a8._4_4_ * fVar183;
    auVar114._8_4_ = auVar286._0_4_ * fVar153 + local_3a8._8_4_ * fVar185;
    auVar114._12_4_ = auVar286._4_4_ * fVar179 + local_3a8._12_4_ * fVar204;
    auVar259._0_4_ = auVar304._0_4_ * fVar99 + auVar362._0_4_ * fVar181;
    auVar259._4_4_ = auVar304._4_4_ * fVar101 + auVar362._4_4_ * fVar183;
    auVar259._8_4_ = auVar304._0_4_ * fVar153 + auVar362._0_4_ * fVar185;
    auVar259._12_4_ = auVar304._4_4_ * fVar179 + auVar362._4_4_ * fVar204;
    auVar305._0_4_ = auVar90._0_4_ * fVar99 + auVar258._0_4_ * fVar181;
    auVar305._4_4_ = auVar90._4_4_ * fVar101 + auVar258._4_4_ * fVar183;
    auVar305._8_4_ = auVar90._0_4_ * fVar153 + auVar258._0_4_ * fVar185;
    auVar305._12_4_ = auVar90._4_4_ * fVar179 + auVar258._4_4_ * fVar204;
    auVar119 = vmovshdup_avx(local_2e8);
    auVar193 = vshufps_avx(local_2e8,local_2e8,0);
    auVar282._16_16_ = auVar193;
    auVar282._0_16_ = auVar193;
    auVar224 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar96._16_16_ = auVar224;
    auVar96._0_16_ = auVar224;
    auVar95 = vsubps_avx(auVar96,auVar282);
    auVar224 = vshufps_avx(auVar140,auVar140,0);
    auVar171 = vshufps_avx(auVar140,auVar140,0x55);
    auVar118 = vshufps_avx(auVar114,auVar114,0);
    auVar170 = vshufps_avx(auVar114,auVar114,0x55);
    auVar92 = vshufps_avx(auVar259,auVar259,0);
    auVar141 = vshufps_avx(auVar259,auVar259,0x55);
    auVar15 = vshufps_avx(auVar305,auVar305,0);
    auVar78 = vshufps_avx(auVar305,auVar305,0x55);
    auVar119 = ZEXT416((uint)((auVar119._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar119 = vshufps_avx(auVar119,auVar119,0);
    auVar295._0_4_ = auVar193._0_4_ + auVar95._0_4_ * 0.0;
    auVar295._4_4_ = auVar193._4_4_ + auVar95._4_4_ * 0.14285715;
    auVar295._8_4_ = auVar193._8_4_ + auVar95._8_4_ * 0.2857143;
    auVar295._12_4_ = auVar193._12_4_ + auVar95._12_4_ * 0.42857146;
    auVar295._16_4_ = auVar193._0_4_ + auVar95._16_4_ * 0.5714286;
    auVar295._20_4_ = auVar193._4_4_ + auVar95._20_4_ * 0.71428573;
    auVar295._24_4_ = auVar193._8_4_ + auVar95._24_4_ * 0.8571429;
    auVar295._28_4_ = auVar193._12_4_ + auVar95._28_4_;
    auVar18 = vsubps_avx(auVar366,auVar295);
    fVar298 = auVar118._0_4_;
    fVar229 = auVar118._4_4_;
    fVar206 = auVar118._8_4_;
    fVar211 = auVar118._12_4_;
    fVar99 = auVar18._0_4_;
    fVar181 = auVar18._4_4_;
    fVar207 = auVar18._8_4_;
    fVar297 = auVar18._12_4_;
    fVar351 = auVar224._12_4_;
    fVar244 = auVar18._16_4_;
    fVar246 = auVar18._20_4_;
    fVar247 = auVar18._24_4_;
    fVar245 = auVar170._0_4_;
    fVar248 = auVar170._4_4_;
    fVar249 = auVar170._8_4_;
    fVar342 = auVar170._12_4_;
    fVar101 = auVar92._0_4_;
    fVar179 = auVar92._4_4_;
    fVar185 = auVar92._8_4_;
    fVar209 = auVar92._12_4_;
    fVar311 = auVar295._0_4_ * fVar101 + fVar298 * fVar99;
    fVar319 = auVar295._4_4_ * fVar179 + fVar229 * fVar181;
    fVar320 = auVar295._8_4_ * fVar185 + fVar206 * fVar207;
    fVar321 = auVar295._12_4_ * fVar209 + fVar211 * fVar297;
    fVar322 = auVar295._16_4_ * fVar101 + fVar298 * fVar244;
    fVar323 = auVar295._20_4_ * fVar179 + fVar229 * fVar246;
    fVar324 = auVar295._24_4_ * fVar185 + fVar206 * fVar247;
    fVar153 = auVar141._0_4_;
    fVar183 = auVar141._4_4_;
    fVar204 = auVar141._8_4_;
    fVar296 = auVar141._12_4_;
    fVar325 = auVar295._0_4_ * fVar153 + fVar245 * fVar99;
    fVar333 = auVar295._4_4_ * fVar183 + fVar248 * fVar181;
    fVar334 = auVar295._8_4_ * fVar204 + fVar249 * fVar207;
    fVar335 = auVar295._12_4_ * fVar296 + fVar342 * fVar297;
    fVar336 = auVar295._16_4_ * fVar153 + fVar245 * fVar244;
    fVar338 = auVar295._20_4_ * fVar183 + fVar248 * fVar246;
    fVar340 = auVar295._24_4_ * fVar204 + fVar249 * fVar247;
    auVar193 = vshufps_avx(auVar140,auVar140,0xaa);
    auVar118 = vshufps_avx(auVar140,auVar140,0xff);
    fVar152 = fVar209 + 0.0;
    auVar170 = vshufps_avx(auVar114,auVar114,0xaa);
    auVar92 = vshufps_avx(auVar114,auVar114,0xff);
    auVar97._0_4_ =
         fVar99 * (fVar298 * auVar295._0_4_ + auVar224._0_4_ * fVar99) + auVar295._0_4_ * fVar311;
    auVar97._4_4_ =
         fVar181 * (fVar229 * auVar295._4_4_ + auVar224._4_4_ * fVar181) + auVar295._4_4_ * fVar319;
    auVar97._8_4_ =
         fVar207 * (fVar206 * auVar295._8_4_ + auVar224._8_4_ * fVar207) + auVar295._8_4_ * fVar320;
    auVar97._12_4_ =
         fVar297 * (fVar211 * auVar295._12_4_ + fVar351 * fVar297) + auVar295._12_4_ * fVar321;
    auVar97._16_4_ =
         fVar244 * (fVar298 * auVar295._16_4_ + auVar224._0_4_ * fVar244) +
         auVar295._16_4_ * fVar322;
    auVar97._20_4_ =
         fVar246 * (fVar229 * auVar295._20_4_ + auVar224._4_4_ * fVar246) +
         auVar295._20_4_ * fVar323;
    auVar97._24_4_ =
         fVar247 * (fVar206 * auVar295._24_4_ + auVar224._8_4_ * fVar247) +
         auVar295._24_4_ * fVar324;
    auVar97._28_4_ = fVar351 + 1.0 + fVar296;
    auVar175._0_4_ =
         fVar99 * (fVar245 * auVar295._0_4_ + fVar99 * auVar171._0_4_) + auVar295._0_4_ * fVar325;
    auVar175._4_4_ =
         fVar181 * (fVar248 * auVar295._4_4_ + fVar181 * auVar171._4_4_) + auVar295._4_4_ * fVar333;
    auVar175._8_4_ =
         fVar207 * (fVar249 * auVar295._8_4_ + fVar207 * auVar171._8_4_) + auVar295._8_4_ * fVar334;
    auVar175._12_4_ =
         fVar297 * (fVar342 * auVar295._12_4_ + fVar297 * auVar171._12_4_) +
         auVar295._12_4_ * fVar335;
    auVar175._16_4_ =
         fVar244 * (fVar245 * auVar295._16_4_ + fVar244 * auVar171._0_4_) +
         auVar295._16_4_ * fVar336;
    auVar175._20_4_ =
         fVar246 * (fVar248 * auVar295._20_4_ + fVar246 * auVar171._4_4_) +
         auVar295._20_4_ * fVar338;
    auVar175._24_4_ =
         fVar247 * (fVar249 * auVar295._24_4_ + fVar247 * auVar171._8_4_) +
         auVar295._24_4_ * fVar340;
    auVar175._28_4_ = fVar351 + 1.0 + fVar296;
    auVar201._0_4_ =
         fVar99 * fVar311 + auVar295._0_4_ * (auVar15._0_4_ * auVar295._0_4_ + fVar99 * fVar101);
    auVar201._4_4_ =
         fVar181 * fVar319 + auVar295._4_4_ * (auVar15._4_4_ * auVar295._4_4_ + fVar181 * fVar179);
    auVar201._8_4_ =
         fVar207 * fVar320 + auVar295._8_4_ * (auVar15._8_4_ * auVar295._8_4_ + fVar207 * fVar185);
    auVar201._12_4_ =
         fVar297 * fVar321 +
         auVar295._12_4_ * (auVar15._12_4_ * auVar295._12_4_ + fVar297 * fVar209);
    auVar201._16_4_ =
         fVar244 * fVar322 + auVar295._16_4_ * (auVar15._0_4_ * auVar295._16_4_ + fVar244 * fVar101)
    ;
    auVar201._20_4_ =
         fVar246 * fVar323 + auVar295._20_4_ * (auVar15._4_4_ * auVar295._20_4_ + fVar246 * fVar179)
    ;
    auVar201._24_4_ =
         fVar247 * fVar324 + auVar295._24_4_ * (auVar15._8_4_ * auVar295._24_4_ + fVar247 * fVar185)
    ;
    auVar201._28_4_ = fVar296 + fVar152;
    auVar310._0_4_ =
         fVar99 * fVar325 + auVar295._0_4_ * (auVar78._0_4_ * auVar295._0_4_ + fVar99 * fVar153);
    auVar310._4_4_ =
         fVar181 * fVar333 + auVar295._4_4_ * (auVar78._4_4_ * auVar295._4_4_ + fVar181 * fVar183);
    auVar310._8_4_ =
         fVar207 * fVar334 + auVar295._8_4_ * (auVar78._8_4_ * auVar295._8_4_ + fVar207 * fVar204);
    auVar310._12_4_ =
         fVar297 * fVar335 +
         auVar295._12_4_ * (auVar78._12_4_ * auVar295._12_4_ + fVar297 * fVar296);
    auVar310._16_4_ =
         fVar244 * fVar336 + auVar295._16_4_ * (auVar78._0_4_ * auVar295._16_4_ + fVar244 * fVar153)
    ;
    auVar310._20_4_ =
         fVar246 * fVar338 + auVar295._20_4_ * (auVar78._4_4_ * auVar295._20_4_ + fVar246 * fVar183)
    ;
    auVar310._24_4_ =
         fVar247 * fVar340 + auVar295._24_4_ * (auVar78._8_4_ * auVar295._24_4_ + fVar247 * fVar204)
    ;
    auVar310._28_4_ = fVar152 + fVar296 + 0.0;
    local_78._0_4_ = fVar99 * auVar97._0_4_ + auVar295._0_4_ * auVar201._0_4_;
    local_78._4_4_ = fVar181 * auVar97._4_4_ + auVar295._4_4_ * auVar201._4_4_;
    local_78._8_4_ = fVar207 * auVar97._8_4_ + auVar295._8_4_ * auVar201._8_4_;
    local_78._12_4_ = fVar297 * auVar97._12_4_ + auVar295._12_4_ * auVar201._12_4_;
    local_78._16_4_ = fVar244 * auVar97._16_4_ + auVar295._16_4_ * auVar201._16_4_;
    local_78._20_4_ = fVar246 * auVar97._20_4_ + auVar295._20_4_ * auVar201._20_4_;
    local_78._24_4_ = fVar247 * auVar97._24_4_ + auVar295._24_4_ * auVar201._24_4_;
    local_78._28_4_ = fVar351 + fVar211 + fVar296 + 0.0;
    local_98._0_4_ = fVar99 * auVar175._0_4_ + auVar295._0_4_ * auVar310._0_4_;
    local_98._4_4_ = fVar181 * auVar175._4_4_ + auVar295._4_4_ * auVar310._4_4_;
    local_98._8_4_ = fVar207 * auVar175._8_4_ + auVar295._8_4_ * auVar310._8_4_;
    local_98._12_4_ = fVar297 * auVar175._12_4_ + auVar295._12_4_ * auVar310._12_4_;
    local_98._16_4_ = fVar244 * auVar175._16_4_ + auVar295._16_4_ * auVar310._16_4_;
    local_98._20_4_ = fVar246 * auVar175._20_4_ + auVar295._20_4_ * auVar310._20_4_;
    local_98._24_4_ = fVar247 * auVar175._24_4_ + auVar295._24_4_ * auVar310._24_4_;
    local_98._28_4_ = fVar351 + fVar211 + fVar152;
    auVar19 = vsubps_avx(auVar201,auVar97);
    auVar95 = vsubps_avx(auVar310,auVar175);
    local_538 = auVar119._0_4_;
    fStack_534 = auVar119._4_4_;
    fStack_530 = auVar119._8_4_;
    fStack_52c = auVar119._12_4_;
    local_d8 = local_538 * auVar19._0_4_ * 3.0;
    fStack_d4 = fStack_534 * auVar19._4_4_ * 3.0;
    auVar20._4_4_ = fStack_d4;
    auVar20._0_4_ = local_d8;
    fStack_d0 = fStack_530 * auVar19._8_4_ * 3.0;
    auVar20._8_4_ = fStack_d0;
    fStack_cc = fStack_52c * auVar19._12_4_ * 3.0;
    auVar20._12_4_ = fStack_cc;
    fStack_c8 = local_538 * auVar19._16_4_ * 3.0;
    auVar20._16_4_ = fStack_c8;
    fStack_c4 = fStack_534 * auVar19._20_4_ * 3.0;
    auVar20._20_4_ = fStack_c4;
    fStack_c0 = fStack_530 * auVar19._24_4_ * 3.0;
    auVar20._24_4_ = fStack_c0;
    auVar20._28_4_ = auVar19._28_4_;
    fVar319 = local_538 * auVar95._0_4_ * 3.0;
    fVar206 = fStack_534 * auVar95._4_4_ * 3.0;
    auVar21._4_4_ = fVar206;
    auVar21._0_4_ = fVar319;
    fVar320 = fStack_530 * auVar95._8_4_ * 3.0;
    auVar21._8_4_ = fVar320;
    fVar211 = fStack_52c * auVar95._12_4_ * 3.0;
    auVar21._12_4_ = fVar211;
    fVar321 = local_538 * auVar95._16_4_ * 3.0;
    auVar21._16_4_ = fVar321;
    fVar322 = fStack_534 * auVar95._20_4_ * 3.0;
    auVar21._20_4_ = fVar322;
    fVar323 = fStack_530 * auVar95._24_4_ * 3.0;
    auVar21._24_4_ = fVar323;
    auVar21._28_4_ = auVar201._28_4_;
    auVar20 = vsubps_avx(local_78,auVar20);
    auVar95 = vperm2f128_avx(auVar20,auVar20,1);
    auVar95 = vshufps_avx(auVar95,auVar20,0x30);
    auVar95 = vshufps_avx(auVar20,auVar95,0x29);
    auVar21 = vsubps_avx(local_98,auVar21);
    auVar20 = vperm2f128_avx(auVar21,auVar21,1);
    auVar20 = vshufps_avx(auVar20,auVar21,0x30);
    auVar96 = vshufps_avx(auVar21,auVar20,0x29);
    fVar353 = auVar170._0_4_;
    fVar358 = auVar170._4_4_;
    fVar359 = auVar170._8_4_;
    fVar101 = auVar92._0_4_;
    fVar183 = auVar92._4_4_;
    fVar209 = auVar92._8_4_;
    fVar298 = auVar92._12_4_;
    fVar352 = auVar118._12_4_;
    auVar119 = vshufps_avx(auVar259,auVar259,0xaa);
    fVar153 = auVar119._0_4_;
    fVar185 = auVar119._4_4_;
    fVar296 = auVar119._8_4_;
    fVar311 = auVar119._12_4_;
    fVar335 = auVar295._0_4_ * fVar153 + fVar353 * fVar99;
    fVar336 = auVar295._4_4_ * fVar185 + fVar358 * fVar181;
    fVar338 = auVar295._8_4_ * fVar296 + fVar359 * fVar207;
    fVar340 = auVar295._12_4_ * fVar311 + auVar170._12_4_ * fVar297;
    fVar337 = auVar295._16_4_ * fVar153 + fVar353 * fVar244;
    fVar339 = auVar295._20_4_ * fVar185 + fVar358 * fVar246;
    fVar341 = auVar295._24_4_ * fVar296 + fVar359 * fVar247;
    fVar342 = fVar352 + fVar351 + fVar342;
    auVar119 = vshufps_avx(auVar259,auVar259,0xff);
    fVar179 = auVar119._0_4_;
    fVar204 = auVar119._4_4_;
    fVar152 = auVar119._8_4_;
    fVar229 = auVar119._12_4_;
    fVar324 = auVar295._0_4_ * fVar179 + fVar99 * fVar101;
    fVar245 = auVar295._4_4_ * fVar204 + fVar181 * fVar183;
    fVar325 = auVar295._8_4_ * fVar152 + fVar207 * fVar209;
    fVar248 = auVar295._12_4_ * fVar229 + fVar297 * fVar298;
    fVar333 = auVar295._16_4_ * fVar179 + fVar244 * fVar101;
    fVar249 = auVar295._20_4_ * fVar204 + fVar246 * fVar183;
    fVar334 = auVar295._24_4_ * fVar152 + fVar247 * fVar209;
    auVar119 = vshufps_avx(auVar305,auVar305,0xaa);
    auVar224 = vshufps_avx(auVar305,auVar305,0xff);
    fVar351 = auVar224._12_4_;
    auVar98._0_4_ =
         auVar295._0_4_ * fVar335 + fVar99 * (fVar353 * auVar295._0_4_ + auVar193._0_4_ * fVar99);
    auVar98._4_4_ =
         auVar295._4_4_ * fVar336 + fVar181 * (fVar358 * auVar295._4_4_ + auVar193._4_4_ * fVar181);
    auVar98._8_4_ =
         auVar295._8_4_ * fVar338 + fVar207 * (fVar359 * auVar295._8_4_ + auVar193._8_4_ * fVar207);
    auVar98._12_4_ =
         auVar295._12_4_ * fVar340 +
         fVar297 * (auVar170._12_4_ * auVar295._12_4_ + auVar193._12_4_ * fVar297);
    auVar98._16_4_ =
         auVar295._16_4_ * fVar337 +
         fVar244 * (fVar353 * auVar295._16_4_ + auVar193._0_4_ * fVar244);
    auVar98._20_4_ =
         auVar295._20_4_ * fVar339 +
         fVar246 * (fVar358 * auVar295._20_4_ + auVar193._4_4_ * fVar246);
    auVar98._24_4_ =
         auVar295._24_4_ * fVar341 +
         fVar247 * (fVar359 * auVar295._24_4_ + auVar193._8_4_ * fVar247);
    auVar98._28_4_ = fVar351 + auVar21._28_4_ + auVar20._28_4_;
    auVar350._0_4_ =
         auVar295._0_4_ * fVar324 + fVar99 * (auVar295._0_4_ * fVar101 + auVar118._0_4_ * fVar99);
    auVar350._4_4_ =
         auVar295._4_4_ * fVar245 + fVar181 * (auVar295._4_4_ * fVar183 + auVar118._4_4_ * fVar181);
    auVar350._8_4_ =
         auVar295._8_4_ * fVar325 + fVar207 * (auVar295._8_4_ * fVar209 + auVar118._8_4_ * fVar207);
    auVar350._12_4_ =
         auVar295._12_4_ * fVar248 + fVar297 * (auVar295._12_4_ * fVar298 + fVar352 * fVar297);
    auVar350._16_4_ =
         auVar295._16_4_ * fVar333 +
         fVar244 * (auVar295._16_4_ * fVar101 + auVar118._0_4_ * fVar244);
    auVar350._20_4_ =
         auVar295._20_4_ * fVar249 +
         fVar246 * (auVar295._20_4_ * fVar183 + auVar118._4_4_ * fVar246);
    auVar350._24_4_ =
         auVar295._24_4_ * fVar334 +
         fVar247 * (auVar295._24_4_ * fVar209 + auVar118._8_4_ * fVar247);
    auVar350._28_4_ = fVar351 + auVar20._28_4_ + auVar201._28_4_;
    auVar20 = vperm2f128_avx(local_78,local_78,1);
    auVar20 = vshufps_avx(auVar20,local_78,0x30);
    auVar97 = vshufps_avx(local_78,auVar20,0x29);
    auVar202._0_4_ =
         fVar99 * fVar335 + auVar295._0_4_ * (auVar119._0_4_ * auVar295._0_4_ + fVar99 * fVar153);
    auVar202._4_4_ =
         fVar181 * fVar336 + auVar295._4_4_ * (auVar119._4_4_ * auVar295._4_4_ + fVar181 * fVar185);
    auVar202._8_4_ =
         fVar207 * fVar338 + auVar295._8_4_ * (auVar119._8_4_ * auVar295._8_4_ + fVar207 * fVar296);
    auVar202._12_4_ =
         fVar297 * fVar340 +
         auVar295._12_4_ * (auVar119._12_4_ * auVar295._12_4_ + fVar297 * fVar311);
    auVar202._16_4_ =
         fVar244 * fVar337 +
         auVar295._16_4_ * (auVar119._0_4_ * auVar295._16_4_ + fVar244 * fVar153);
    auVar202._20_4_ =
         fVar246 * fVar339 +
         auVar295._20_4_ * (auVar119._4_4_ * auVar295._20_4_ + fVar246 * fVar185);
    auVar202._24_4_ =
         fVar247 * fVar341 +
         auVar295._24_4_ * (auVar119._8_4_ * auVar295._24_4_ + fVar247 * fVar296);
    auVar202._28_4_ = fVar342 + auVar119._12_4_ + fVar311;
    auVar243._0_4_ =
         fVar99 * fVar324 + auVar295._0_4_ * (auVar224._0_4_ * auVar295._0_4_ + fVar99 * fVar179);
    auVar243._4_4_ =
         fVar181 * fVar245 + auVar295._4_4_ * (auVar224._4_4_ * auVar295._4_4_ + fVar181 * fVar204);
    auVar243._8_4_ =
         fVar207 * fVar325 + auVar295._8_4_ * (auVar224._8_4_ * auVar295._8_4_ + fVar207 * fVar152);
    auVar243._12_4_ =
         fVar297 * fVar248 + auVar295._12_4_ * (fVar351 * auVar295._12_4_ + fVar297 * fVar229);
    auVar243._16_4_ =
         fVar244 * fVar333 +
         auVar295._16_4_ * (auVar224._0_4_ * auVar295._16_4_ + fVar244 * fVar179);
    auVar243._20_4_ =
         fVar246 * fVar249 +
         auVar295._20_4_ * (auVar224._4_4_ * auVar295._20_4_ + fVar246 * fVar204);
    auVar243._24_4_ =
         fVar247 * fVar334 +
         auVar295._24_4_ * (auVar224._8_4_ * auVar295._24_4_ + fVar247 * fVar152);
    auVar243._28_4_ = fVar352 + fVar298 + fVar351 + fVar229;
    auVar262._0_4_ = fVar99 * auVar98._0_4_ + auVar295._0_4_ * auVar202._0_4_;
    auVar262._4_4_ = fVar181 * auVar98._4_4_ + auVar295._4_4_ * auVar202._4_4_;
    auVar262._8_4_ = fVar207 * auVar98._8_4_ + auVar295._8_4_ * auVar202._8_4_;
    auVar262._12_4_ = fVar297 * auVar98._12_4_ + auVar295._12_4_ * auVar202._12_4_;
    auVar262._16_4_ = fVar244 * auVar98._16_4_ + auVar295._16_4_ * auVar202._16_4_;
    auVar262._20_4_ = fVar246 * auVar98._20_4_ + auVar295._20_4_ * auVar202._20_4_;
    auVar262._24_4_ = fVar247 * auVar98._24_4_ + auVar295._24_4_ * auVar202._24_4_;
    auVar262._28_4_ = fVar342 + fVar351 + fVar229;
    auVar283._0_4_ = fVar99 * auVar350._0_4_ + auVar295._0_4_ * auVar243._0_4_;
    auVar283._4_4_ = fVar181 * auVar350._4_4_ + auVar295._4_4_ * auVar243._4_4_;
    auVar283._8_4_ = fVar207 * auVar350._8_4_ + auVar295._8_4_ * auVar243._8_4_;
    auVar283._12_4_ = fVar297 * auVar350._12_4_ + auVar295._12_4_ * auVar243._12_4_;
    auVar283._16_4_ = fVar244 * auVar350._16_4_ + auVar295._16_4_ * auVar243._16_4_;
    auVar283._20_4_ = fVar246 * auVar350._20_4_ + auVar295._20_4_ * auVar243._20_4_;
    auVar283._24_4_ = fVar247 * auVar350._24_4_ + auVar295._24_4_ * auVar243._24_4_;
    auVar283._28_4_ = auVar18._28_4_ + auVar295._28_4_;
    auVar20 = vsubps_avx(auVar202,auVar98);
    auVar18 = vsubps_avx(auVar243,auVar350);
    local_f8 = local_538 * auVar20._0_4_ * 3.0;
    fStack_f4 = fStack_534 * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_f4;
    auVar16._0_4_ = local_f8;
    fStack_f0 = fStack_530 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_f0;
    fStack_ec = fStack_52c * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_ec;
    fStack_e8 = local_538 * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_e8;
    fStack_e4 = fStack_534 * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_e4;
    fStack_e0 = fStack_530 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_e0;
    auVar16._28_4_ = auVar243._28_4_;
    local_118 = local_538 * auVar18._0_4_ * 3.0;
    fStack_114 = fStack_534 * auVar18._4_4_ * 3.0;
    auVar17._4_4_ = fStack_114;
    auVar17._0_4_ = local_118;
    fStack_110 = fStack_530 * auVar18._8_4_ * 3.0;
    auVar17._8_4_ = fStack_110;
    fStack_10c = fStack_52c * auVar18._12_4_ * 3.0;
    auVar17._12_4_ = fStack_10c;
    local_538 = local_538 * auVar18._16_4_ * 3.0;
    auVar17._16_4_ = local_538;
    fStack_534 = fStack_534 * auVar18._20_4_ * 3.0;
    auVar17._20_4_ = fStack_534;
    fStack_530 = fStack_530 * auVar18._24_4_ * 3.0;
    auVar17._24_4_ = fStack_530;
    auVar17._28_4_ = fStack_52c;
    auVar20 = vperm2f128_avx(auVar262,auVar262,1);
    auVar20 = vshufps_avx(auVar20,auVar262,0x30);
    auVar98 = vshufps_avx(auVar262,auVar20,0x29);
    auVar18 = vsubps_avx(auVar262,auVar16);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar16 = vshufps_avx(auVar18,auVar20,0x29);
    auVar18 = vsubps_avx(auVar283,auVar17);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar17 = vshufps_avx(auVar18,auVar20,0x29);
    auVar21 = vsubps_avx(auVar262,local_78);
    auVar22 = vsubps_avx(auVar98,auVar97);
    fVar99 = auVar22._0_4_ + auVar21._0_4_;
    fVar101 = auVar22._4_4_ + auVar21._4_4_;
    fVar153 = auVar22._8_4_ + auVar21._8_4_;
    fVar179 = auVar22._12_4_ + auVar21._12_4_;
    fVar181 = auVar22._16_4_ + auVar21._16_4_;
    fVar183 = auVar22._20_4_ + auVar21._20_4_;
    fVar185 = auVar22._24_4_ + auVar21._24_4_;
    auVar18 = vperm2f128_avx(local_98,local_98,1);
    auVar18 = vshufps_avx(auVar18,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar18,0x29);
    auVar18 = vperm2f128_avx(auVar283,auVar283,1);
    auVar18 = vshufps_avx(auVar18,auVar283,0x30);
    auVar175 = vshufps_avx(auVar283,auVar18,0x29);
    auVar18 = vsubps_avx(auVar283,local_98);
    auVar202 = vsubps_avx(auVar175,local_b8);
    fVar204 = auVar18._0_4_ + auVar202._0_4_;
    fVar207 = auVar18._4_4_ + auVar202._4_4_;
    fVar209 = auVar18._8_4_ + auVar202._8_4_;
    fVar296 = auVar18._12_4_ + auVar202._12_4_;
    fVar152 = auVar18._16_4_ + auVar202._16_4_;
    fVar297 = auVar18._20_4_ + auVar202._20_4_;
    fVar298 = auVar18._24_4_ + auVar202._24_4_;
    fVar311 = auVar18._28_4_;
    auVar18._4_4_ = local_98._4_4_ * fVar101;
    auVar18._0_4_ = local_98._0_4_ * fVar99;
    auVar18._8_4_ = local_98._8_4_ * fVar153;
    auVar18._12_4_ = local_98._12_4_ * fVar179;
    auVar18._16_4_ = local_98._16_4_ * fVar181;
    auVar18._20_4_ = local_98._20_4_ * fVar183;
    auVar18._24_4_ = local_98._24_4_ * fVar185;
    auVar18._28_4_ = fVar311;
    auVar23._4_4_ = fVar207 * local_78._4_4_;
    auVar23._0_4_ = fVar204 * local_78._0_4_;
    auVar23._8_4_ = fVar209 * local_78._8_4_;
    auVar23._12_4_ = fVar296 * local_78._12_4_;
    auVar23._16_4_ = fVar152 * local_78._16_4_;
    auVar23._20_4_ = fVar297 * local_78._20_4_;
    auVar23._24_4_ = fVar298 * local_78._24_4_;
    auVar23._28_4_ = auVar20._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar23);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar19._28_4_;
    fVar319 = local_98._0_4_ + fVar319;
    fVar206 = local_98._4_4_ + fVar206;
    fVar320 = local_98._8_4_ + fVar320;
    fVar211 = local_98._12_4_ + fVar211;
    fVar321 = local_98._16_4_ + fVar321;
    fVar322 = local_98._20_4_ + fVar322;
    fVar323 = local_98._24_4_ + fVar323;
    auVar19._4_4_ = fVar206 * fVar101;
    auVar19._0_4_ = fVar319 * fVar99;
    auVar19._8_4_ = fVar320 * fVar153;
    auVar19._12_4_ = fVar211 * fVar179;
    auVar19._16_4_ = fVar321 * fVar181;
    auVar19._20_4_ = fVar322 * fVar183;
    auVar19._24_4_ = fVar323 * fVar185;
    auVar19._28_4_ = fVar311;
    auVar24._4_4_ = fVar207 * fStack_d4;
    auVar24._0_4_ = fVar204 * local_d8;
    auVar24._8_4_ = fVar209 * fStack_d0;
    auVar24._12_4_ = fVar296 * fStack_cc;
    auVar24._16_4_ = fVar152 * fStack_c8;
    auVar24._20_4_ = fVar297 * fStack_c4;
    auVar24._24_4_ = fVar298 * fStack_c0;
    auVar24._28_4_ = fStack_bc;
    auVar19 = vsubps_avx(auVar19,auVar24);
    auVar25._4_4_ = auVar96._4_4_ * fVar101;
    auVar25._0_4_ = auVar96._0_4_ * fVar99;
    auVar25._8_4_ = auVar96._8_4_ * fVar153;
    auVar25._12_4_ = auVar96._12_4_ * fVar179;
    auVar25._16_4_ = auVar96._16_4_ * fVar181;
    auVar25._20_4_ = auVar96._20_4_ * fVar183;
    auVar25._24_4_ = auVar96._24_4_ * fVar185;
    auVar25._28_4_ = fVar311;
    local_4f8 = auVar95._0_4_;
    fStack_4f4 = auVar95._4_4_;
    fStack_4f0 = auVar95._8_4_;
    fStack_4ec = auVar95._12_4_;
    fStack_4e8 = auVar95._16_4_;
    fStack_4e4 = auVar95._20_4_;
    fStack_4e0 = auVar95._24_4_;
    auVar26._4_4_ = fVar207 * fStack_4f4;
    auVar26._0_4_ = fVar204 * local_4f8;
    auVar26._8_4_ = fVar209 * fStack_4f0;
    auVar26._12_4_ = fVar296 * fStack_4ec;
    auVar26._16_4_ = fVar152 * fStack_4e8;
    auVar26._20_4_ = fVar297 * fStack_4e4;
    auVar26._24_4_ = fVar298 * fStack_4e0;
    auVar26._28_4_ = 0x40400000;
    auVar23 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = local_b8._4_4_ * fVar101;
    auVar27._0_4_ = local_b8._0_4_ * fVar99;
    auVar27._8_4_ = local_b8._8_4_ * fVar153;
    auVar27._12_4_ = local_b8._12_4_ * fVar179;
    auVar27._16_4_ = local_b8._16_4_ * fVar181;
    auVar27._20_4_ = local_b8._20_4_ * fVar183;
    auVar27._24_4_ = local_b8._24_4_ * fVar185;
    auVar27._28_4_ = fVar311;
    auVar28._4_4_ = auVar97._4_4_ * fVar207;
    auVar28._0_4_ = auVar97._0_4_ * fVar204;
    auVar28._8_4_ = auVar97._8_4_ * fVar209;
    auVar28._12_4_ = auVar97._12_4_ * fVar296;
    auVar28._16_4_ = auVar97._16_4_ * fVar152;
    auVar28._20_4_ = auVar97._20_4_ * fVar297;
    auVar28._24_4_ = auVar97._24_4_ * fVar298;
    auVar28._28_4_ = local_b8._28_4_;
    auVar24 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = auVar283._4_4_ * fVar101;
    auVar29._0_4_ = auVar283._0_4_ * fVar99;
    auVar29._8_4_ = auVar283._8_4_ * fVar153;
    auVar29._12_4_ = auVar283._12_4_ * fVar179;
    auVar29._16_4_ = auVar283._16_4_ * fVar181;
    auVar29._20_4_ = auVar283._20_4_ * fVar183;
    auVar29._24_4_ = auVar283._24_4_ * fVar185;
    auVar29._28_4_ = fVar311;
    auVar30._4_4_ = fVar207 * auVar262._4_4_;
    auVar30._0_4_ = fVar204 * auVar262._0_4_;
    auVar30._8_4_ = fVar209 * auVar262._8_4_;
    auVar30._12_4_ = fVar296 * auVar262._12_4_;
    auVar30._16_4_ = fVar152 * auVar262._16_4_;
    auVar30._20_4_ = fVar297 * auVar262._20_4_;
    auVar30._24_4_ = fVar298 * auVar262._24_4_;
    auVar30._28_4_ = auVar96._28_4_;
    auVar25 = vsubps_avx(auVar29,auVar30);
    local_f8 = auVar262._0_4_ + local_f8;
    fStack_f4 = auVar262._4_4_ + fStack_f4;
    fStack_f0 = auVar262._8_4_ + fStack_f0;
    fStack_ec = auVar262._12_4_ + fStack_ec;
    fStack_e8 = auVar262._16_4_ + fStack_e8;
    fStack_e4 = auVar262._20_4_ + fStack_e4;
    fStack_e0 = auVar262._24_4_ + fStack_e0;
    fStack_dc = auVar262._28_4_ + auVar243._28_4_;
    local_118 = auVar283._0_4_ + local_118;
    fStack_114 = auVar283._4_4_ + fStack_114;
    fStack_110 = auVar283._8_4_ + fStack_110;
    fStack_10c = auVar283._12_4_ + fStack_10c;
    fStack_108 = auVar283._16_4_ + local_538;
    fStack_104 = auVar283._20_4_ + fStack_534;
    fStack_100 = auVar283._24_4_ + fStack_530;
    fStack_fc = auVar283._28_4_ + fStack_52c;
    auVar31._4_4_ = fStack_114 * fVar101;
    auVar31._0_4_ = local_118 * fVar99;
    auVar31._8_4_ = fStack_110 * fVar153;
    auVar31._12_4_ = fStack_10c * fVar179;
    auVar31._16_4_ = fStack_108 * fVar181;
    auVar31._20_4_ = fStack_104 * fVar183;
    auVar31._24_4_ = fStack_100 * fVar185;
    auVar31._28_4_ = auVar283._28_4_ + fStack_52c;
    auVar32._4_4_ = fStack_f4 * fVar207;
    auVar32._0_4_ = local_f8 * fVar204;
    auVar32._8_4_ = fStack_f0 * fVar209;
    auVar32._12_4_ = fStack_ec * fVar296;
    auVar32._16_4_ = fStack_e8 * fVar152;
    auVar32._20_4_ = fStack_e4 * fVar297;
    auVar32._24_4_ = fStack_e0 * fVar298;
    auVar32._28_4_ = fStack_dc;
    auVar26 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar17._4_4_ * fVar101;
    auVar33._0_4_ = auVar17._0_4_ * fVar99;
    auVar33._8_4_ = auVar17._8_4_ * fVar153;
    auVar33._12_4_ = auVar17._12_4_ * fVar179;
    auVar33._16_4_ = auVar17._16_4_ * fVar181;
    auVar33._20_4_ = auVar17._20_4_ * fVar183;
    auVar33._24_4_ = auVar17._24_4_ * fVar185;
    auVar33._28_4_ = fStack_dc;
    auVar34._4_4_ = fVar207 * auVar16._4_4_;
    auVar34._0_4_ = fVar204 * auVar16._0_4_;
    auVar34._8_4_ = fVar209 * auVar16._8_4_;
    auVar34._12_4_ = fVar296 * auVar16._12_4_;
    auVar34._16_4_ = fVar152 * auVar16._16_4_;
    auVar34._20_4_ = fVar297 * auVar16._20_4_;
    auVar34._24_4_ = fVar298 * auVar16._24_4_;
    auVar34._28_4_ = auVar16._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar175._4_4_ * fVar101;
    auVar35._0_4_ = auVar175._0_4_ * fVar99;
    auVar35._8_4_ = auVar175._8_4_ * fVar153;
    auVar35._12_4_ = auVar175._12_4_ * fVar179;
    auVar35._16_4_ = auVar175._16_4_ * fVar181;
    auVar35._20_4_ = auVar175._20_4_ * fVar183;
    auVar35._24_4_ = auVar175._24_4_ * fVar185;
    auVar35._28_4_ = auVar22._28_4_ + auVar21._28_4_;
    auVar22._4_4_ = auVar98._4_4_ * fVar207;
    auVar22._0_4_ = auVar98._0_4_ * fVar204;
    auVar22._8_4_ = auVar98._8_4_ * fVar209;
    auVar22._12_4_ = auVar98._12_4_ * fVar296;
    auVar22._16_4_ = auVar98._16_4_ * fVar152;
    auVar22._20_4_ = auVar98._20_4_ * fVar297;
    auVar22._24_4_ = auVar98._24_4_ * fVar298;
    auVar22._28_4_ = fVar311 + auVar202._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar20 = vminps_avx(auVar18,auVar19);
    auVar95 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vminps_avx(auVar23,auVar24);
    auVar18 = vminps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar23,auVar24);
    auVar95 = vmaxps_avx(auVar95,auVar20);
    auVar19 = vminps_avx(auVar25,auVar26);
    auVar20 = vmaxps_avx(auVar25,auVar26);
    auVar21 = vminps_avx(auVar27,auVar22);
    auVar19 = vminps_avx(auVar19,auVar21);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar27,auVar22);
    auVar20 = vmaxps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar95,auVar20);
    auVar95 = vcmpps_avx(auVar19,local_138,2);
    auVar20 = vcmpps_avx(auVar20,local_158,5);
    auVar95 = vandps_avx(auVar20,auVar95);
    auVar20 = local_228 & auVar95;
    uVar67 = 0;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar20 = vsubps_avx(auVar97,local_78);
      auVar18 = vsubps_avx(auVar98,auVar262);
      fVar101 = auVar20._0_4_ + auVar18._0_4_;
      fVar153 = auVar20._4_4_ + auVar18._4_4_;
      fVar179 = auVar20._8_4_ + auVar18._8_4_;
      fVar181 = auVar20._12_4_ + auVar18._12_4_;
      fVar183 = auVar20._16_4_ + auVar18._16_4_;
      fVar185 = auVar20._20_4_ + auVar18._20_4_;
      fVar204 = auVar20._24_4_ + auVar18._24_4_;
      auVar19 = vsubps_avx(local_b8,local_98);
      auVar21 = vsubps_avx(auVar175,auVar283);
      fVar207 = auVar19._0_4_ + auVar21._0_4_;
      fVar209 = auVar19._4_4_ + auVar21._4_4_;
      fVar296 = auVar19._8_4_ + auVar21._8_4_;
      fVar152 = auVar19._12_4_ + auVar21._12_4_;
      fVar297 = auVar19._16_4_ + auVar21._16_4_;
      fVar298 = auVar19._20_4_ + auVar21._20_4_;
      fVar311 = auVar19._24_4_ + auVar21._24_4_;
      fVar99 = auVar21._28_4_;
      auVar36._4_4_ = local_98._4_4_ * fVar153;
      auVar36._0_4_ = local_98._0_4_ * fVar101;
      auVar36._8_4_ = local_98._8_4_ * fVar179;
      auVar36._12_4_ = local_98._12_4_ * fVar181;
      auVar36._16_4_ = local_98._16_4_ * fVar183;
      auVar36._20_4_ = local_98._20_4_ * fVar185;
      auVar36._24_4_ = local_98._24_4_ * fVar204;
      auVar36._28_4_ = local_98._28_4_;
      auVar37._4_4_ = local_78._4_4_ * fVar209;
      auVar37._0_4_ = local_78._0_4_ * fVar207;
      auVar37._8_4_ = local_78._8_4_ * fVar296;
      auVar37._12_4_ = local_78._12_4_ * fVar152;
      auVar37._16_4_ = local_78._16_4_ * fVar297;
      auVar37._20_4_ = local_78._20_4_ * fVar298;
      auVar37._24_4_ = local_78._24_4_ * fVar311;
      auVar37._28_4_ = local_78._28_4_;
      auVar21 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar206 * fVar153;
      auVar38._0_4_ = fVar319 * fVar101;
      auVar38._8_4_ = fVar320 * fVar179;
      auVar38._12_4_ = fVar211 * fVar181;
      auVar38._16_4_ = fVar321 * fVar183;
      auVar38._20_4_ = fVar322 * fVar185;
      auVar38._24_4_ = fVar323 * fVar204;
      auVar38._28_4_ = local_98._28_4_;
      auVar39._4_4_ = fVar209 * fStack_d4;
      auVar39._0_4_ = fVar207 * local_d8;
      auVar39._8_4_ = fVar296 * fStack_d0;
      auVar39._12_4_ = fVar152 * fStack_cc;
      auVar39._16_4_ = fVar297 * fStack_c8;
      auVar39._20_4_ = fVar298 * fStack_c4;
      auVar39._24_4_ = fVar311 * fStack_c0;
      auVar39._28_4_ = fVar99;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar153 * auVar96._4_4_;
      auVar40._0_4_ = fVar101 * auVar96._0_4_;
      auVar40._8_4_ = fVar179 * auVar96._8_4_;
      auVar40._12_4_ = fVar181 * auVar96._12_4_;
      auVar40._16_4_ = fVar183 * auVar96._16_4_;
      auVar40._20_4_ = fVar185 * auVar96._20_4_;
      auVar40._24_4_ = fVar204 * auVar96._24_4_;
      auVar40._28_4_ = fVar99;
      auVar41._4_4_ = fVar209 * fStack_4f4;
      auVar41._0_4_ = fVar207 * local_4f8;
      auVar41._8_4_ = fVar296 * fStack_4f0;
      auVar41._12_4_ = fVar152 * fStack_4ec;
      auVar41._16_4_ = fVar297 * fStack_4e8;
      auVar41._20_4_ = fVar298 * fStack_4e4;
      auVar41._24_4_ = fVar311 * fStack_4e0;
      auVar41._28_4_ = local_98._28_4_ + auVar201._28_4_;
      auVar96 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_b8._4_4_ * fVar153;
      auVar42._0_4_ = local_b8._0_4_ * fVar101;
      auVar42._8_4_ = local_b8._8_4_ * fVar179;
      auVar42._12_4_ = local_b8._12_4_ * fVar181;
      auVar42._16_4_ = local_b8._16_4_ * fVar183;
      auVar42._20_4_ = local_b8._20_4_ * fVar185;
      auVar42._24_4_ = local_b8._24_4_ * fVar204;
      auVar42._28_4_ = local_98._28_4_ + auVar201._28_4_;
      auVar43._4_4_ = auVar97._4_4_ * fVar209;
      auVar43._0_4_ = auVar97._0_4_ * fVar207;
      auVar43._8_4_ = auVar97._8_4_ * fVar296;
      auVar43._12_4_ = auVar97._12_4_ * fVar152;
      auVar43._16_4_ = auVar97._16_4_ * fVar297;
      auVar43._20_4_ = auVar97._20_4_ * fVar298;
      uVar5 = auVar97._28_4_;
      auVar43._24_4_ = auVar97._24_4_ * fVar311;
      auVar43._28_4_ = uVar5;
      auVar97 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar283._4_4_ * fVar153;
      auVar44._0_4_ = auVar283._0_4_ * fVar101;
      auVar44._8_4_ = auVar283._8_4_ * fVar179;
      auVar44._12_4_ = auVar283._12_4_ * fVar181;
      auVar44._16_4_ = auVar283._16_4_ * fVar183;
      auVar44._20_4_ = auVar283._20_4_ * fVar185;
      auVar44._24_4_ = auVar283._24_4_ * fVar204;
      auVar44._28_4_ = auVar283._28_4_;
      auVar45._4_4_ = auVar262._4_4_ * fVar209;
      auVar45._0_4_ = auVar262._0_4_ * fVar207;
      auVar45._8_4_ = auVar262._8_4_ * fVar296;
      auVar45._12_4_ = auVar262._12_4_ * fVar152;
      auVar45._16_4_ = auVar262._16_4_ * fVar297;
      auVar45._20_4_ = auVar262._20_4_ * fVar298;
      auVar45._24_4_ = auVar262._24_4_ * fVar311;
      auVar45._28_4_ = auVar262._28_4_;
      auVar202 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar153 * fStack_114;
      auVar46._0_4_ = fVar101 * local_118;
      auVar46._8_4_ = fVar179 * fStack_110;
      auVar46._12_4_ = fVar181 * fStack_10c;
      auVar46._16_4_ = fVar183 * fStack_108;
      auVar46._20_4_ = fVar185 * fStack_104;
      auVar46._24_4_ = fVar204 * fStack_100;
      auVar46._28_4_ = auVar283._28_4_;
      auVar47._4_4_ = fVar209 * fStack_f4;
      auVar47._0_4_ = fVar207 * local_f8;
      auVar47._8_4_ = fVar296 * fStack_f0;
      auVar47._12_4_ = fVar152 * fStack_ec;
      auVar47._16_4_ = fVar297 * fStack_e8;
      auVar47._20_4_ = fVar298 * fStack_e4;
      auVar47._24_4_ = fVar311 * fStack_e0;
      auVar47._28_4_ = uVar5;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar153 * auVar17._4_4_;
      auVar48._0_4_ = fVar101 * auVar17._0_4_;
      auVar48._8_4_ = fVar179 * auVar17._8_4_;
      auVar48._12_4_ = fVar181 * auVar17._12_4_;
      auVar48._16_4_ = fVar183 * auVar17._16_4_;
      auVar48._20_4_ = fVar185 * auVar17._20_4_;
      auVar48._24_4_ = fVar204 * auVar17._24_4_;
      auVar48._28_4_ = uVar5;
      auVar49._4_4_ = fVar209 * auVar16._4_4_;
      auVar49._0_4_ = fVar207 * auVar16._0_4_;
      auVar49._8_4_ = fVar296 * auVar16._8_4_;
      auVar49._12_4_ = fVar152 * auVar16._12_4_;
      auVar49._16_4_ = fVar297 * auVar16._16_4_;
      auVar49._20_4_ = fVar298 * auVar16._20_4_;
      auVar49._24_4_ = fVar311 * auVar16._24_4_;
      auVar49._28_4_ = local_b8._28_4_;
      auVar16 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = auVar175._4_4_ * fVar153;
      auVar50._0_4_ = auVar175._0_4_ * fVar101;
      auVar50._8_4_ = auVar175._8_4_ * fVar179;
      auVar50._12_4_ = auVar175._12_4_ * fVar181;
      auVar50._16_4_ = auVar175._16_4_ * fVar183;
      auVar50._20_4_ = auVar175._20_4_ * fVar185;
      auVar50._24_4_ = auVar175._24_4_ * fVar204;
      auVar50._28_4_ = auVar20._28_4_ + auVar18._28_4_;
      auVar51._4_4_ = auVar98._4_4_ * fVar209;
      auVar51._0_4_ = auVar98._0_4_ * fVar207;
      auVar51._8_4_ = auVar98._8_4_ * fVar296;
      auVar51._12_4_ = auVar98._12_4_ * fVar152;
      auVar51._16_4_ = auVar98._16_4_ * fVar297;
      auVar51._20_4_ = auVar98._20_4_ * fVar298;
      auVar51._24_4_ = auVar98._24_4_ * fVar311;
      auVar51._28_4_ = auVar19._28_4_ + fVar99;
      auVar98 = vsubps_avx(auVar50,auVar51);
      auVar18 = vminps_avx(auVar21,auVar22);
      auVar20 = vmaxps_avx(auVar21,auVar22);
      auVar19 = vminps_avx(auVar96,auVar97);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar96,auVar97);
      auVar20 = vmaxps_avx(auVar20,auVar18);
      auVar21 = vminps_avx(auVar202,auVar23);
      auVar18 = vmaxps_avx(auVar202,auVar23);
      auVar96 = vminps_avx(auVar16,auVar98);
      auVar21 = vminps_avx(auVar21,auVar96);
      auVar21 = vminps_avx(auVar19,auVar21);
      auVar19 = vmaxps_avx(auVar16,auVar98);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar20,auVar18);
      auVar20 = vcmpps_avx(auVar21,local_138,2);
      auVar18 = vcmpps_avx(auVar18,local_158,5);
      auVar20 = vandps_avx(auVar18,auVar20);
      auVar95 = vandps_avx(auVar95,local_228);
      auVar18 = auVar95 & auVar20;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar20,auVar95);
        uVar67 = vmovmskps_avx(auVar95);
      }
    }
    if (uVar67 != 0) {
      auStack_398[uVar69] = uVar67;
      uVar6 = vmovlps_avx(local_2e8);
      *(undefined8 *)(afStack_208 + uVar69 * 2) = uVar6;
      uVar73 = vmovlps_avx(_local_5b8);
      auStack_58[uVar69] = uVar73;
      uVar69 = (ulong)((int)uVar69 + 1);
    }
    auVar367 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar69 == 0) {
        if (bVar65) {
          return local_5f9;
        }
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar94._4_4_ = uVar5;
        auVar94._0_4_ = uVar5;
        auVar94._8_4_ = uVar5;
        auVar94._12_4_ = uVar5;
        auVar119 = vcmpps_avx(local_2f8,auVar94,2);
        uVar67 = vmovmskps_avx(auVar119);
        uVar66 = uVar66 & uVar66 + 0xf & uVar67;
        local_5f9 = uVar66 != 0;
        if (!local_5f9) {
          return local_5f9;
        }
        goto LAB_01090722;
      }
      uVar71 = (int)uVar69 - 1;
      uVar72 = (ulong)uVar71;
      uVar67 = auStack_398[uVar72];
      fVar99 = afStack_208[uVar72 * 2];
      fVar101 = afStack_208[uVar72 * 2 + 1];
      register0x00001588 = 0;
      local_5b8 = (undefined1  [8])auStack_58[uVar72];
      uVar73 = 0;
      if (uVar67 != 0) {
        for (; (uVar67 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
        }
      }
      uVar67 = uVar67 - 1 & uVar67;
      auStack_398[uVar72] = uVar67;
      if (uVar67 == 0) {
        uVar69 = (ulong)uVar71;
      }
      auVar216._8_4_ = 0x3f800000;
      auVar216._0_8_ = &DAT_3f8000003f800000;
      auVar216._12_4_ = 0x3f800000;
      fVar179 = (float)(uVar73 + 1) * 0.14285715;
      fVar153 = (1.0 - (float)uVar73 * 0.14285715) * fVar99 + fVar101 * (float)uVar73 * 0.14285715;
      fVar99 = (1.0 - fVar179) * fVar99 + fVar101 * fVar179;
      fVar101 = fVar99 - fVar153;
      if (0.16666667 <= fVar101) break;
      auVar119 = vshufps_avx(_local_5b8,_local_5b8,0x50);
      auVar193 = vsubps_avx(auVar216,auVar119);
      fVar179 = auVar119._0_4_;
      fVar181 = auVar119._4_4_;
      fVar183 = auVar119._8_4_;
      fVar185 = auVar119._12_4_;
      fVar204 = auVar193._0_4_;
      fVar207 = auVar193._4_4_;
      fVar209 = auVar193._8_4_;
      fVar296 = auVar193._12_4_;
      auVar164._0_4_ = auVar273._0_4_ * fVar179 + fVar204 * auVar331._0_4_;
      auVar164._4_4_ = auVar273._4_4_ * fVar181 + fVar207 * auVar331._4_4_;
      auVar164._8_4_ = auVar273._0_4_ * fVar183 + fVar209 * auVar331._0_4_;
      auVar164._12_4_ = auVar273._4_4_ * fVar185 + fVar296 * auVar331._4_4_;
      auVar194._0_4_ = auVar286._0_4_ * fVar179 + fVar204 * (float)local_3a8._0_4_;
      auVar194._4_4_ = auVar286._4_4_ * fVar181 + fVar207 * (float)local_3a8._4_4_;
      auVar194._8_4_ = auVar286._0_4_ * fVar183 + fVar209 * fStack_3a0;
      auVar194._12_4_ = auVar286._4_4_ * fVar185 + fVar296 * fStack_39c;
      auVar217._0_4_ = auVar304._0_4_ * fVar179 + fVar204 * auVar362._0_4_;
      auVar217._4_4_ = auVar304._4_4_ * fVar181 + fVar207 * auVar362._4_4_;
      auVar217._8_4_ = auVar304._0_4_ * fVar183 + fVar209 * auVar362._0_4_;
      auVar217._12_4_ = auVar304._4_4_ * fVar185 + fVar296 * auVar362._4_4_;
      auVar115._0_4_ = auVar90._0_4_ * fVar179 + auVar258._0_4_ * fVar204;
      auVar115._4_4_ = auVar90._4_4_ * fVar181 + auVar258._4_4_ * fVar207;
      auVar115._8_4_ = auVar90._0_4_ * fVar183 + auVar258._0_4_ * fVar209;
      auVar115._12_4_ = auVar90._4_4_ * fVar185 + auVar258._4_4_ * fVar296;
      auVar149._16_16_ = auVar164;
      auVar149._0_16_ = auVar164;
      auVar176._16_16_ = auVar194;
      auVar176._0_16_ = auVar194;
      auVar203._16_16_ = auVar217;
      auVar203._0_16_ = auVar217;
      auVar95 = vshufps_avx(ZEXT2032(CONCAT416(fVar99,ZEXT416((uint)fVar153))),
                            ZEXT2032(CONCAT416(fVar99,ZEXT416((uint)fVar153))),0);
      auVar20 = vsubps_avx(auVar176,auVar149);
      fVar179 = auVar95._0_4_;
      fVar181 = auVar95._4_4_;
      fVar183 = auVar95._8_4_;
      fVar185 = auVar95._12_4_;
      fVar204 = auVar95._16_4_;
      fVar207 = auVar95._20_4_;
      fVar209 = auVar95._24_4_;
      auVar150._0_4_ = auVar164._0_4_ + auVar20._0_4_ * fVar179;
      auVar150._4_4_ = auVar164._4_4_ + auVar20._4_4_ * fVar181;
      auVar150._8_4_ = auVar164._8_4_ + auVar20._8_4_ * fVar183;
      auVar150._12_4_ = auVar164._12_4_ + auVar20._12_4_ * fVar185;
      auVar150._16_4_ = auVar164._0_4_ + auVar20._16_4_ * fVar204;
      auVar150._20_4_ = auVar164._4_4_ + auVar20._20_4_ * fVar207;
      auVar150._24_4_ = auVar164._8_4_ + auVar20._24_4_ * fVar209;
      auVar150._28_4_ = auVar164._12_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar203,auVar176);
      auVar177._0_4_ = auVar194._0_4_ + auVar20._0_4_ * fVar179;
      auVar177._4_4_ = auVar194._4_4_ + auVar20._4_4_ * fVar181;
      auVar177._8_4_ = auVar194._8_4_ + auVar20._8_4_ * fVar183;
      auVar177._12_4_ = auVar194._12_4_ + auVar20._12_4_ * fVar185;
      auVar177._16_4_ = auVar194._0_4_ + auVar20._16_4_ * fVar204;
      auVar177._20_4_ = auVar194._4_4_ + auVar20._20_4_ * fVar207;
      auVar177._24_4_ = auVar194._8_4_ + auVar20._24_4_ * fVar209;
      auVar177._28_4_ = auVar194._12_4_ + auVar20._28_4_;
      auVar119 = vsubps_avx(auVar115,auVar217);
      auVar128._0_4_ = auVar217._0_4_ + auVar119._0_4_ * fVar179;
      auVar128._4_4_ = auVar217._4_4_ + auVar119._4_4_ * fVar181;
      auVar128._8_4_ = auVar217._8_4_ + auVar119._8_4_ * fVar183;
      auVar128._12_4_ = auVar217._12_4_ + auVar119._12_4_ * fVar185;
      auVar128._16_4_ = auVar217._0_4_ + auVar119._0_4_ * fVar204;
      auVar128._20_4_ = auVar217._4_4_ + auVar119._4_4_ * fVar207;
      auVar128._24_4_ = auVar217._8_4_ + auVar119._8_4_ * fVar209;
      auVar128._28_4_ = auVar217._12_4_ + auVar119._12_4_;
      auVar20 = vsubps_avx(auVar177,auVar150);
      auVar151._0_4_ = auVar150._0_4_ + fVar179 * auVar20._0_4_;
      auVar151._4_4_ = auVar150._4_4_ + fVar181 * auVar20._4_4_;
      auVar151._8_4_ = auVar150._8_4_ + fVar183 * auVar20._8_4_;
      auVar151._12_4_ = auVar150._12_4_ + fVar185 * auVar20._12_4_;
      auVar151._16_4_ = auVar150._16_4_ + fVar204 * auVar20._16_4_;
      auVar151._20_4_ = auVar150._20_4_ + fVar207 * auVar20._20_4_;
      auVar151._24_4_ = auVar150._24_4_ + fVar209 * auVar20._24_4_;
      auVar151._28_4_ = auVar150._28_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar128,auVar177);
      auVar129._0_4_ = auVar177._0_4_ + fVar179 * auVar20._0_4_;
      auVar129._4_4_ = auVar177._4_4_ + fVar181 * auVar20._4_4_;
      auVar129._8_4_ = auVar177._8_4_ + fVar183 * auVar20._8_4_;
      auVar129._12_4_ = auVar177._12_4_ + fVar185 * auVar20._12_4_;
      auVar129._16_4_ = auVar177._16_4_ + fVar204 * auVar20._16_4_;
      auVar129._20_4_ = auVar177._20_4_ + fVar207 * auVar20._20_4_;
      auVar129._24_4_ = auVar177._24_4_ + fVar209 * auVar20._24_4_;
      auVar129._28_4_ = auVar177._28_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar129,auVar151);
      auVar165._0_4_ = auVar151._0_4_ + fVar179 * auVar20._0_4_;
      auVar165._4_4_ = auVar151._4_4_ + fVar181 * auVar20._4_4_;
      auVar165._8_4_ = auVar151._8_4_ + fVar183 * auVar20._8_4_;
      auVar165._12_4_ = auVar151._12_4_ + fVar185 * auVar20._12_4_;
      auVar178._16_4_ = auVar151._16_4_ + fVar204 * auVar20._16_4_;
      auVar178._0_16_ = auVar165;
      auVar178._20_4_ = auVar151._20_4_ + fVar207 * auVar20._20_4_;
      auVar178._24_4_ = auVar151._24_4_ + fVar209 * auVar20._24_4_;
      auVar178._28_4_ = auVar151._28_4_ + auVar177._28_4_;
      fVar179 = auVar20._4_4_ * 3.0;
      auVar141 = auVar178._16_16_;
      auVar118 = vshufps_avx(ZEXT416((uint)(fVar101 * 0.33333334)),
                             ZEXT416((uint)(fVar101 * 0.33333334)),0);
      auVar287._0_4_ = auVar165._0_4_ + auVar118._0_4_ * auVar20._0_4_ * 3.0;
      auVar287._4_4_ = auVar165._4_4_ + auVar118._4_4_ * fVar179;
      auVar287._8_4_ = auVar165._8_4_ + auVar118._8_4_ * auVar20._8_4_ * 3.0;
      auVar287._12_4_ = auVar165._12_4_ + auVar118._12_4_ * auVar20._12_4_ * 3.0;
      auVar224 = vshufpd_avx(auVar165,auVar165,3);
      auVar171 = vshufpd_avx(auVar141,auVar141,3);
      auVar119 = vsubps_avx(auVar224,auVar165);
      auVar193 = vsubps_avx(auVar171,auVar141);
      auVar116._0_4_ = auVar119._0_4_ + auVar193._0_4_;
      auVar116._4_4_ = auVar119._4_4_ + auVar193._4_4_;
      auVar116._8_4_ = auVar119._8_4_ + auVar193._8_4_;
      auVar116._12_4_ = auVar119._12_4_ + auVar193._12_4_;
      auVar119 = vmovshdup_avx(auVar165);
      auVar193 = vmovshdup_avx(auVar287);
      auVar170 = vshufps_avx(auVar116,auVar116,0);
      auVar92 = vshufps_avx(auVar116,auVar116,0x55);
      fVar207 = auVar92._0_4_;
      fVar209 = auVar92._4_4_;
      fVar296 = auVar92._8_4_;
      fVar152 = auVar92._12_4_;
      fVar181 = auVar170._0_4_;
      fVar183 = auVar170._4_4_;
      fVar185 = auVar170._8_4_;
      fVar204 = auVar170._12_4_;
      auVar274._0_4_ = fVar181 * auVar165._0_4_ + fVar207 * auVar119._0_4_;
      auVar274._4_4_ = fVar183 * auVar165._4_4_ + fVar209 * auVar119._4_4_;
      auVar274._8_4_ = fVar185 * auVar165._8_4_ + fVar296 * auVar119._8_4_;
      auVar274._12_4_ = fVar204 * auVar165._12_4_ + fVar152 * auVar119._12_4_;
      auVar288._0_4_ = auVar287._0_4_ * fVar181 + fVar207 * auVar193._0_4_;
      auVar288._4_4_ = auVar287._4_4_ * fVar183 + fVar209 * auVar193._4_4_;
      auVar288._8_4_ = auVar287._8_4_ * fVar185 + fVar296 * auVar193._8_4_;
      auVar288._12_4_ = auVar287._12_4_ * fVar204 + fVar152 * auVar193._12_4_;
      auVar193 = vshufps_avx(auVar274,auVar274,0xe8);
      auVar170 = vshufps_avx(auVar288,auVar288,0xe8);
      auVar119 = vcmpps_avx(auVar193,auVar170,1);
      uVar67 = vextractps_avx(auVar119,0);
      auVar92 = auVar288;
      if ((uVar67 & 1) == 0) {
        auVar92 = auVar274;
      }
      auVar117._0_4_ = auVar118._0_4_ * auVar20._16_4_ * 3.0;
      auVar117._4_4_ = auVar118._4_4_ * fVar179;
      auVar117._8_4_ = auVar118._8_4_ * auVar20._24_4_ * 3.0;
      auVar117._12_4_ = auVar118._12_4_ * auVar95._28_4_;
      auVar78 = vsubps_avx(auVar141,auVar117);
      auVar118 = vmovshdup_avx(auVar78);
      auVar141 = vmovshdup_avx(auVar141);
      fVar179 = auVar78._0_4_;
      fVar297 = auVar78._4_4_;
      auVar364._0_4_ = fVar181 * fVar179 + fVar207 * auVar118._0_4_;
      auVar364._4_4_ = fVar183 * fVar297 + fVar209 * auVar118._4_4_;
      auVar364._8_4_ = fVar185 * auVar78._8_4_ + fVar296 * auVar118._8_4_;
      auVar364._12_4_ = fVar204 * auVar78._12_4_ + fVar152 * auVar118._12_4_;
      auVar347._0_4_ = fVar181 * auVar178._16_4_ + fVar207 * auVar141._0_4_;
      auVar347._4_4_ = fVar183 * auVar178._20_4_ + fVar209 * auVar141._4_4_;
      auVar347._8_4_ = fVar185 * auVar178._24_4_ + fVar296 * auVar141._8_4_;
      auVar347._12_4_ = fVar204 * auVar178._28_4_ + fVar152 * auVar141._12_4_;
      auVar141 = vshufps_avx(auVar364,auVar364,0xe8);
      auVar15 = vshufps_avx(auVar347,auVar347,0xe8);
      auVar118 = vcmpps_avx(auVar141,auVar15,1);
      uVar67 = vextractps_avx(auVar118,0);
      auVar79 = auVar347;
      if ((uVar67 & 1) == 0) {
        auVar79 = auVar364;
      }
      auVar92 = vmaxss_avx(auVar79,auVar92);
      auVar193 = vminps_avx(auVar193,auVar170);
      auVar170 = vminps_avx(auVar141,auVar15);
      auVar170 = vminps_avx(auVar193,auVar170);
      auVar119 = vshufps_avx(auVar119,auVar119,0x55);
      auVar119 = vblendps_avx(auVar119,auVar118,2);
      auVar118 = vpslld_avx(auVar119,0x1f);
      auVar119 = vshufpd_avx(auVar288,auVar288,1);
      auVar119 = vinsertps_avx(auVar119,auVar347,0x9c);
      auVar193 = vshufpd_avx(auVar274,auVar274,1);
      auVar193 = vinsertps_avx(auVar193,auVar364,0x9c);
      auVar119 = vblendvps_avx(auVar193,auVar119,auVar118);
      auVar193 = vmovshdup_avx(auVar119);
      auVar119 = vmaxss_avx(auVar193,auVar119);
      fVar185 = auVar170._0_4_;
      auVar193 = vmovshdup_avx(auVar170);
      fVar183 = auVar119._0_4_;
      fVar204 = auVar193._0_4_;
      fVar181 = auVar92._0_4_;
      if ((0.0001 <= fVar185) || (fVar183 <= -0.0001)) {
        if ((-0.0001 < fVar181 && fVar204 < 0.0001) ||
           ((fVar185 < 0.0001 && -0.0001 < fVar181 || (fVar204 < 0.0001 && -0.0001 < fVar183))))
        goto LAB_01091dfa;
LAB_01092a31:
        bVar52 = true;
        auVar367 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_01091dfa:
        auVar367 = ZEXT464(0) << 0x20;
        auVar118 = vcmpps_avx(auVar170,ZEXT416(0) << 0x20,1);
        auVar193 = vcmpss_avx(auVar92,ZEXT416(0),1);
        auVar355._8_4_ = 0x3f800000;
        auVar355._0_8_ = &DAT_3f8000003f800000;
        auVar355._12_4_ = 0x3f800000;
        auVar218._8_4_ = 0xbf800000;
        auVar218._0_8_ = 0xbf800000bf800000;
        auVar218._12_4_ = 0xbf800000;
        auVar193 = vblendvps_avx(auVar355,auVar218,auVar193);
        auVar118 = vblendvps_avx(auVar355,auVar218,auVar118);
        auVar141 = vcmpss_avx(auVar193,auVar118,4);
        auVar141 = vpshufd_avx(ZEXT416(auVar141._0_4_ & 1),0x50);
        auVar141 = vpslld_avx(auVar141,0x1f);
        auVar141 = vpsrad_avx(auVar141,0x1f);
        auVar141 = vpandn_avx(auVar141,_DAT_02020eb0);
        auVar15 = vmovshdup_avx(auVar118);
        fVar207 = auVar15._0_4_;
        if ((auVar118._0_4_ != fVar207) || (NAN(auVar118._0_4_) || NAN(fVar207))) {
          if ((fVar204 != fVar185) || (NAN(fVar204) || NAN(fVar185))) {
            fVar185 = -fVar185 / (fVar204 - fVar185);
            auVar118 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar185) * 0.0 + fVar185)));
          }
          else {
            auVar118 = vcmpss_avx(auVar170,ZEXT416(0),0);
            auVar118 = vpshufd_avx(ZEXT416(auVar118._0_4_ & 1),0x50);
            auVar118 = vpslld_avx(auVar118,0x1f);
            auVar118 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar118);
          }
          auVar15 = vcmpps_avx(auVar141,auVar118,1);
          auVar170 = vblendps_avx(auVar141,auVar118,2);
          auVar118 = vblendps_avx(auVar118,auVar141,2);
          auVar141 = vblendvps_avx(auVar118,auVar170,auVar15);
        }
        auVar119 = vcmpss_avx(auVar119,ZEXT416(0),1);
        auVar142._8_4_ = 0xbf800000;
        auVar142._0_8_ = 0xbf800000bf800000;
        auVar142._12_4_ = 0xbf800000;
        auVar119 = vblendvps_avx(auVar355,auVar142,auVar119);
        fVar185 = auVar119._0_4_;
        if ((auVar193._0_4_ != fVar185) || (NAN(auVar193._0_4_) || NAN(fVar185))) {
          if ((fVar183 != fVar181) || (NAN(fVar183) || NAN(fVar181))) {
            fVar181 = -fVar181 / (fVar183 - fVar181);
            auVar119 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar181) * 0.0 + fVar181)));
          }
          else {
            auVar119 = vcmpss_avx(auVar92,ZEXT416(0),0);
            auVar119 = vpshufd_avx(ZEXT416(auVar119._0_4_ & 1),0x50);
            auVar119 = vpslld_avx(auVar119,0x1f);
            auVar119 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar119);
          }
          auVar118 = vcmpps_avx(auVar141,auVar119,1);
          auVar193 = vblendps_avx(auVar141,auVar119,2);
          auVar119 = vblendps_avx(auVar119,auVar141,2);
          auVar141 = vblendvps_avx(auVar119,auVar193,auVar118);
        }
        if ((fVar207 != fVar185) || (NAN(fVar207) || NAN(fVar185))) {
          auVar119 = vcmpps_avx(auVar141,auVar355,1);
          auVar193 = vinsertps_avx(auVar141,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar219._4_12_ = auVar141._4_12_;
          auVar219._0_4_ = 0x3f800000;
          auVar141 = vblendvps_avx(auVar219,auVar193,auVar119);
        }
        auVar119 = vcmpps_avx(auVar141,_DAT_01fec6f0,1);
        auVar53._12_4_ = 0;
        auVar53._0_12_ = auVar141._4_12_;
        auVar193 = vinsertps_avx(auVar141,ZEXT416(0x3f800000),0x10);
        auVar119 = vblendvps_avx(auVar193,auVar53 << 0x20,auVar119);
        auVar193 = vmovshdup_avx(auVar119);
        bVar52 = true;
        if (auVar119._0_4_ <= auVar193._0_4_) {
          auVar120._0_4_ = auVar119._0_4_ + -0.1;
          auVar120._4_4_ = auVar119._4_4_ + 0.1;
          auVar120._8_4_ = auVar119._8_4_ + 0.0;
          auVar120._12_4_ = auVar119._12_4_ + 0.0;
          auVar118 = vshufpd_avx(auVar287,auVar287,3);
          auVar166._8_8_ = 0x3f80000000000000;
          auVar166._0_8_ = 0x3f80000000000000;
          auVar119 = vcmpps_avx(auVar120,auVar166,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar120._4_12_;
          auVar193 = vinsertps_avx(auVar120,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar119 = vblendvps_avx(auVar193,auVar54 << 0x20,auVar119);
          auVar193 = vshufpd_avx(auVar78,auVar78,3);
          auVar170 = vshufps_avx(auVar119,auVar119,0x50);
          auVar92 = vsubps_avx(auVar355,auVar170);
          local_458 = auVar224._0_4_;
          fStack_454 = auVar224._4_4_;
          fStack_450 = auVar224._8_4_;
          fStack_44c = auVar224._12_4_;
          fVar181 = auVar170._0_4_;
          fVar183 = auVar170._4_4_;
          fVar185 = auVar170._8_4_;
          fVar204 = auVar170._12_4_;
          local_558 = auVar171._0_4_;
          fStack_554 = auVar171._4_4_;
          fStack_550 = auVar171._8_4_;
          fStack_54c = auVar171._12_4_;
          fVar207 = auVar92._0_4_;
          fVar209 = auVar92._4_4_;
          fVar296 = auVar92._8_4_;
          fVar152 = auVar92._12_4_;
          auVar143._0_4_ = fVar181 * local_458 + fVar207 * auVar165._0_4_;
          auVar143._4_4_ = fVar183 * fStack_454 + fVar209 * auVar165._4_4_;
          auVar143._8_4_ = fVar185 * fStack_450 + fVar296 * auVar165._0_4_;
          auVar143._12_4_ = fVar204 * fStack_44c + fVar152 * auVar165._4_4_;
          auVar195._0_4_ = fVar181 * auVar118._0_4_ + fVar207 * auVar287._0_4_;
          auVar195._4_4_ = fVar183 * auVar118._4_4_ + fVar209 * auVar287._4_4_;
          auVar195._8_4_ = fVar185 * auVar118._8_4_ + fVar296 * auVar287._0_4_;
          auVar195._12_4_ = fVar204 * auVar118._12_4_ + fVar152 * auVar287._4_4_;
          auVar260._0_4_ = fVar181 * auVar193._0_4_ + fVar207 * fVar179;
          auVar260._4_4_ = fVar183 * auVar193._4_4_ + fVar209 * fVar297;
          auVar260._8_4_ = fVar185 * auVar193._8_4_ + fVar296 * fVar179;
          auVar260._12_4_ = fVar204 * auVar193._12_4_ + fVar152 * fVar297;
          auVar275._0_4_ = fVar181 * local_558 + fVar207 * auVar178._16_4_;
          auVar275._4_4_ = fVar183 * fStack_554 + fVar209 * auVar178._20_4_;
          auVar275._8_4_ = fVar185 * fStack_550 + fVar296 * auVar178._16_4_;
          auVar275._12_4_ = fVar204 * fStack_54c + fVar152 * auVar178._20_4_;
          auVar171 = vsubps_avx(auVar355,auVar119);
          auVar193 = vmovshdup_avx(_local_5b8);
          auVar224 = vmovsldup_avx(_local_5b8);
          local_5b8._0_4_ = auVar171._0_4_ * auVar224._0_4_ + auVar193._0_4_ * auVar119._0_4_;
          local_5b8._4_4_ = auVar171._4_4_ * auVar224._4_4_ + auVar193._4_4_ * auVar119._4_4_;
          fStack_5b0 = auVar171._8_4_ * auVar224._8_4_ + auVar193._8_4_ * auVar119._8_4_;
          fStack_5ac = auVar171._12_4_ * auVar224._12_4_ + auVar193._12_4_ * auVar119._12_4_;
          auVar78 = vmovshdup_avx(_local_5b8);
          auVar119 = vsubps_avx(auVar195,auVar143);
          auVar220._0_4_ = auVar119._0_4_ * 3.0;
          auVar220._4_4_ = auVar119._4_4_ * 3.0;
          auVar220._8_4_ = auVar119._8_4_ * 3.0;
          auVar220._12_4_ = auVar119._12_4_ * 3.0;
          auVar119 = vsubps_avx(auVar260,auVar195);
          auVar239._0_4_ = auVar119._0_4_ * 3.0;
          auVar239._4_4_ = auVar119._4_4_ * 3.0;
          auVar239._8_4_ = auVar119._8_4_ * 3.0;
          auVar239._12_4_ = auVar119._12_4_ * 3.0;
          auVar119 = vsubps_avx(auVar275,auVar260);
          auVar289._0_4_ = auVar119._0_4_ * 3.0;
          auVar289._4_4_ = auVar119._4_4_ * 3.0;
          auVar289._8_4_ = auVar119._8_4_ * 3.0;
          auVar289._12_4_ = auVar119._12_4_ * 3.0;
          auVar193 = vminps_avx(auVar239,auVar289);
          auVar119 = vmaxps_avx(auVar239,auVar289);
          auVar193 = vminps_avx(auVar220,auVar193);
          auVar119 = vmaxps_avx(auVar220,auVar119);
          auVar224 = vshufpd_avx(auVar193,auVar193,3);
          auVar171 = vshufpd_avx(auVar119,auVar119,3);
          auVar193 = vminps_avx(auVar193,auVar224);
          auVar119 = vmaxps_avx(auVar119,auVar171);
          auVar224 = vshufps_avx(ZEXT416((uint)(1.0 / fVar101)),ZEXT416((uint)(1.0 / fVar101)),0);
          auVar221._0_4_ = auVar224._0_4_ * auVar193._0_4_;
          auVar221._4_4_ = auVar224._4_4_ * auVar193._4_4_;
          auVar221._8_4_ = auVar224._8_4_ * auVar193._8_4_;
          auVar221._12_4_ = auVar224._12_4_ * auVar193._12_4_;
          auVar240._0_4_ = auVar119._0_4_ * auVar224._0_4_;
          auVar240._4_4_ = auVar119._4_4_ * auVar224._4_4_;
          auVar240._8_4_ = auVar119._8_4_ * auVar224._8_4_;
          auVar240._12_4_ = auVar119._12_4_ * auVar224._12_4_;
          auVar92 = ZEXT416((uint)(1.0 / (auVar78._0_4_ - (float)local_5b8._0_4_)));
          auVar119 = vshufpd_avx(auVar143,auVar143,3);
          auVar193 = vshufpd_avx(auVar195,auVar195,3);
          auVar224 = vshufpd_avx(auVar260,auVar260,3);
          auVar171 = vshufpd_avx(auVar275,auVar275,3);
          auVar119 = vsubps_avx(auVar119,auVar143);
          auVar118 = vsubps_avx(auVar193,auVar195);
          auVar170 = vsubps_avx(auVar224,auVar260);
          auVar171 = vsubps_avx(auVar171,auVar275);
          auVar193 = vminps_avx(auVar119,auVar118);
          auVar119 = vmaxps_avx(auVar119,auVar118);
          auVar224 = vminps_avx(auVar170,auVar171);
          auVar224 = vminps_avx(auVar193,auVar224);
          auVar193 = vmaxps_avx(auVar170,auVar171);
          auVar119 = vmaxps_avx(auVar119,auVar193);
          auVar193 = vshufps_avx(auVar92,auVar92,0);
          auVar306._0_4_ = auVar193._0_4_ * auVar224._0_4_;
          auVar306._4_4_ = auVar193._4_4_ * auVar224._4_4_;
          auVar306._8_4_ = auVar193._8_4_ * auVar224._8_4_;
          auVar306._12_4_ = auVar193._12_4_ * auVar224._12_4_;
          auVar314._0_4_ = auVar193._0_4_ * auVar119._0_4_;
          auVar314._4_4_ = auVar193._4_4_ * auVar119._4_4_;
          auVar314._8_4_ = auVar193._8_4_ * auVar119._8_4_;
          auVar314._12_4_ = auVar193._12_4_ * auVar119._12_4_;
          auVar119 = vmovsldup_avx(_local_5b8);
          auVar261._4_12_ = auVar119._4_12_;
          auVar261._0_4_ = fVar153;
          auVar276._4_12_ = local_5b8._4_12_;
          auVar276._0_4_ = fVar99;
          auVar93._0_4_ = (fVar99 + fVar153) * 0.5;
          auVar93._4_4_ = ((float)local_5b8._4_4_ + auVar119._4_4_) * 0.5;
          auVar93._8_4_ = (fStack_5b0 + auVar119._8_4_) * 0.5;
          auVar93._12_4_ = (fStack_5ac + auVar119._12_4_) * 0.5;
          auVar119 = vshufps_avx(auVar93,auVar93,0);
          fVar179 = auVar119._0_4_;
          fVar181 = auVar119._4_4_;
          fVar183 = auVar119._8_4_;
          fVar185 = auVar119._12_4_;
          local_598 = auVar270._0_4_;
          fStack_594 = auVar270._4_4_;
          fStack_590 = auVar270._8_4_;
          fStack_58c = auVar270._12_4_;
          auVar196._0_4_ = fVar179 * (float)local_238._0_4_ + local_598;
          auVar196._4_4_ = fVar181 * (float)local_238._4_4_ + fStack_594;
          auVar196._8_4_ = fVar183 * fStack_230 + fStack_590;
          auVar196._12_4_ = fVar185 * fStack_22c + fStack_58c;
          local_508 = auVar14._0_4_;
          fStack_504 = auVar14._4_4_;
          fStack_500 = auVar14._8_4_;
          fStack_4fc = auVar14._12_4_;
          auVar290._0_4_ = fVar179 * (float)local_248._0_4_ + local_508;
          auVar290._4_4_ = fVar181 * (float)local_248._4_4_ + fStack_504;
          auVar290._8_4_ = fVar183 * fStack_240 + fStack_500;
          auVar290._12_4_ = fVar185 * fStack_23c + fStack_4fc;
          local_518 = auVar138._0_4_;
          fStack_514 = auVar138._4_4_;
          fStack_510 = auVar138._8_4_;
          fStack_50c = auVar138._12_4_;
          auVar332._0_4_ = fVar179 * (float)local_258._0_4_ + local_518;
          auVar332._4_4_ = fVar181 * (float)local_258._4_4_ + fStack_514;
          auVar332._8_4_ = fVar183 * fStack_250 + fStack_510;
          auVar332._12_4_ = fVar185 * fStack_24c + fStack_50c;
          auVar119 = vsubps_avx(auVar290,auVar196);
          auVar197._0_4_ = auVar119._0_4_ * fVar179 + auVar196._0_4_;
          auVar197._4_4_ = auVar119._4_4_ * fVar181 + auVar196._4_4_;
          auVar197._8_4_ = auVar119._8_4_ * fVar183 + auVar196._8_4_;
          auVar197._12_4_ = auVar119._12_4_ * fVar185 + auVar196._12_4_;
          auVar119 = vsubps_avx(auVar332,auVar290);
          auVar291._0_4_ = auVar290._0_4_ + auVar119._0_4_ * fVar179;
          auVar291._4_4_ = auVar290._4_4_ + auVar119._4_4_ * fVar181;
          auVar291._8_4_ = auVar290._8_4_ + auVar119._8_4_ * fVar183;
          auVar291._12_4_ = auVar290._12_4_ + auVar119._12_4_ * fVar185;
          auVar119 = vsubps_avx(auVar291,auVar197);
          fVar179 = auVar197._0_4_ + auVar119._0_4_ * fVar179;
          fVar181 = auVar197._4_4_ + auVar119._4_4_ * fVar181;
          auVar144._0_8_ = CONCAT44(fVar181,fVar179);
          auVar144._8_4_ = auVar197._8_4_ + auVar119._8_4_ * fVar183;
          auVar144._12_4_ = auVar197._12_4_ + auVar119._12_4_ * fVar185;
          fVar183 = auVar119._0_4_ * 3.0;
          fVar185 = auVar119._4_4_ * 3.0;
          auVar198._0_8_ = CONCAT44(fVar185,fVar183);
          auVar198._8_4_ = auVar119._8_4_ * 3.0;
          auVar198._12_4_ = auVar119._12_4_ * 3.0;
          auVar292._8_8_ = auVar144._0_8_;
          auVar292._0_8_ = auVar144._0_8_;
          auVar119 = vshufpd_avx(auVar144,auVar144,3);
          auVar193 = vshufps_avx(auVar93,auVar93,0x55);
          auVar170 = vsubps_avx(auVar119,auVar292);
          auVar293._0_4_ = auVar193._0_4_ * auVar170._0_4_ + fVar179;
          auVar293._4_4_ = auVar193._4_4_ * auVar170._4_4_ + fVar181;
          auVar293._8_4_ = auVar193._8_4_ * auVar170._8_4_ + fVar179;
          auVar293._12_4_ = auVar193._12_4_ * auVar170._12_4_ + fVar181;
          auVar348._8_8_ = auVar198._0_8_;
          auVar348._0_8_ = auVar198._0_8_;
          auVar119 = vshufpd_avx(auVar198,auVar198,1);
          auVar119 = vsubps_avx(auVar119,auVar348);
          auVar199._0_4_ = fVar183 + auVar193._0_4_ * auVar119._0_4_;
          auVar199._4_4_ = fVar185 + auVar193._4_4_ * auVar119._4_4_;
          auVar199._8_4_ = fVar183 + auVar193._8_4_ * auVar119._8_4_;
          auVar199._12_4_ = fVar185 + auVar193._12_4_ * auVar119._12_4_;
          auVar193 = vmovshdup_avx(auVar199);
          auVar349._0_8_ = auVar193._0_8_ ^ 0x8000000080000000;
          auVar349._8_4_ = auVar193._8_4_ ^ 0x80000000;
          auVar349._12_4_ = auVar193._12_4_ ^ 0x80000000;
          auVar224 = vmovshdup_avx(auVar170);
          auVar119 = vunpcklps_avx(auVar224,auVar349);
          auVar171 = vshufps_avx(auVar119,auVar349,4);
          auVar145._0_8_ = auVar170._0_8_ ^ 0x8000000080000000;
          auVar145._8_4_ = -auVar170._8_4_;
          auVar145._12_4_ = -auVar170._12_4_;
          auVar119 = vmovlhps_avx(auVar145,auVar199);
          auVar118 = vshufps_avx(auVar119,auVar199,8);
          auVar119 = ZEXT416((uint)(auVar224._0_4_ * auVar199._0_4_ -
                                   auVar193._0_4_ * auVar170._0_4_));
          auVar193 = vshufps_avx(auVar119,auVar119,0);
          auVar119 = vdivps_avx(auVar171,auVar193);
          auVar193 = vdivps_avx(auVar118,auVar193);
          auVar118 = vinsertps_avx(auVar221,auVar306,0x1c);
          auVar170 = vinsertps_avx(auVar240,auVar314,0x1c);
          auVar92 = vinsertps_avx(auVar306,auVar221,0x4c);
          auVar141 = vinsertps_avx(auVar314,auVar240,0x4c);
          auVar224 = vmovsldup_avx(auVar119);
          auVar315._0_4_ = auVar224._0_4_ * auVar118._0_4_;
          auVar315._4_4_ = auVar224._4_4_ * auVar118._4_4_;
          auVar315._8_4_ = auVar224._8_4_ * auVar118._8_4_;
          auVar315._12_4_ = auVar224._12_4_ * auVar118._12_4_;
          auVar307._0_4_ = auVar224._0_4_ * auVar170._0_4_;
          auVar307._4_4_ = auVar224._4_4_ * auVar170._4_4_;
          auVar307._8_4_ = auVar224._8_4_ * auVar170._8_4_;
          auVar307._12_4_ = auVar224._12_4_ * auVar170._12_4_;
          auVar171 = vminps_avx(auVar315,auVar307);
          auVar224 = vmaxps_avx(auVar307,auVar315);
          auVar15 = vmovsldup_avx(auVar193);
          auVar365._0_4_ = auVar15._0_4_ * auVar92._0_4_;
          auVar365._4_4_ = auVar15._4_4_ * auVar92._4_4_;
          auVar365._8_4_ = auVar15._8_4_ * auVar92._8_4_;
          auVar365._12_4_ = auVar15._12_4_ * auVar92._12_4_;
          auVar308._0_4_ = auVar15._0_4_ * auVar141._0_4_;
          auVar308._4_4_ = auVar15._4_4_ * auVar141._4_4_;
          auVar308._8_4_ = auVar15._8_4_ * auVar141._8_4_;
          auVar308._12_4_ = auVar15._12_4_ * auVar141._12_4_;
          auVar15 = vminps_avx(auVar365,auVar308);
          auVar121._0_4_ = auVar171._0_4_ + auVar15._0_4_;
          auVar121._4_4_ = auVar171._4_4_ + auVar15._4_4_;
          auVar121._8_4_ = auVar171._8_4_ + auVar15._8_4_;
          auVar121._12_4_ = auVar171._12_4_ + auVar15._12_4_;
          auVar171 = vmaxps_avx(auVar308,auVar365);
          auVar15 = vsubps_avx(auVar261,auVar93);
          auVar79 = vsubps_avx(auVar276,auVar93);
          auVar277._0_4_ = auVar224._0_4_ + auVar171._0_4_;
          auVar277._4_4_ = auVar224._4_4_ + auVar171._4_4_;
          auVar277._8_4_ = auVar224._8_4_ + auVar171._8_4_;
          auVar277._12_4_ = auVar224._12_4_ + auVar171._12_4_;
          auVar316._8_8_ = 0x3f800000;
          auVar316._0_8_ = 0x3f800000;
          auVar224 = vsubps_avx(auVar316,auVar277);
          auVar171 = vsubps_avx(auVar316,auVar121);
          fVar209 = auVar15._0_4_;
          auVar317._0_4_ = fVar209 * auVar224._0_4_;
          fVar296 = auVar15._4_4_;
          auVar317._4_4_ = fVar296 * auVar224._4_4_;
          fVar152 = auVar15._8_4_;
          auVar317._8_4_ = fVar152 * auVar224._8_4_;
          fVar297 = auVar15._12_4_;
          auVar317._12_4_ = fVar297 * auVar224._12_4_;
          fVar183 = auVar79._0_4_;
          auVar278._0_4_ = auVar224._0_4_ * fVar183;
          fVar185 = auVar79._4_4_;
          auVar278._4_4_ = auVar224._4_4_ * fVar185;
          fVar204 = auVar79._8_4_;
          auVar278._8_4_ = auVar224._8_4_ * fVar204;
          fVar207 = auVar79._12_4_;
          auVar278._12_4_ = auVar224._12_4_ * fVar207;
          auVar356._0_4_ = fVar209 * auVar171._0_4_;
          auVar356._4_4_ = fVar296 * auVar171._4_4_;
          auVar356._8_4_ = fVar152 * auVar171._8_4_;
          auVar356._12_4_ = fVar297 * auVar171._12_4_;
          auVar122._0_4_ = fVar183 * auVar171._0_4_;
          auVar122._4_4_ = fVar185 * auVar171._4_4_;
          auVar122._8_4_ = fVar204 * auVar171._8_4_;
          auVar122._12_4_ = fVar207 * auVar171._12_4_;
          auVar224 = vminps_avx(auVar317,auVar356);
          auVar171 = vminps_avx(auVar278,auVar122);
          auVar15 = vminps_avx(auVar224,auVar171);
          auVar224 = vmaxps_avx(auVar356,auVar317);
          auVar171 = vmaxps_avx(auVar122,auVar278);
          auVar79 = vshufps_avx(auVar93,auVar93,0x54);
          auVar171 = vmaxps_avx(auVar171,auVar224);
          auVar80 = vshufps_avx(auVar293,auVar293,0);
          auVar106 = vshufps_avx(auVar293,auVar293,0x55);
          auVar224 = vhaddps_avx(auVar15,auVar15);
          auVar171 = vhaddps_avx(auVar171,auVar171);
          auVar279._0_4_ = auVar80._0_4_ * auVar119._0_4_ + auVar106._0_4_ * auVar193._0_4_;
          auVar279._4_4_ = auVar80._4_4_ * auVar119._4_4_ + auVar106._4_4_ * auVar193._4_4_;
          auVar279._8_4_ = auVar80._8_4_ * auVar119._8_4_ + auVar106._8_4_ * auVar193._8_4_;
          auVar279._12_4_ = auVar80._12_4_ * auVar119._12_4_ + auVar106._12_4_ * auVar193._12_4_;
          auVar15 = vsubps_avx(auVar79,auVar279);
          fVar179 = auVar15._0_4_ + auVar224._0_4_;
          fVar181 = auVar15._0_4_ + auVar171._0_4_;
          auVar224 = vmaxss_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar179));
          auVar171 = vminss_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar99));
          if (auVar224._0_4_ <= auVar171._0_4_) {
            auVar224 = vmovshdup_avx(auVar119);
            auVar167._0_4_ = auVar118._0_4_ * auVar224._0_4_;
            auVar167._4_4_ = auVar118._4_4_ * auVar224._4_4_;
            auVar167._8_4_ = auVar118._8_4_ * auVar224._8_4_;
            auVar167._12_4_ = auVar118._12_4_ * auVar224._12_4_;
            auVar123._0_4_ = auVar170._0_4_ * auVar224._0_4_;
            auVar123._4_4_ = auVar170._4_4_ * auVar224._4_4_;
            auVar123._8_4_ = auVar170._8_4_ * auVar224._8_4_;
            auVar123._12_4_ = auVar170._12_4_ * auVar224._12_4_;
            auVar171 = vminps_avx(auVar167,auVar123);
            auVar224 = vmaxps_avx(auVar123,auVar167);
            auVar118 = vmovshdup_avx(auVar193);
            auVar222._0_4_ = auVar118._0_4_ * auVar92._0_4_;
            auVar222._4_4_ = auVar118._4_4_ * auVar92._4_4_;
            auVar222._8_4_ = auVar118._8_4_ * auVar92._8_4_;
            auVar222._12_4_ = auVar118._12_4_ * auVar92._12_4_;
            auVar168._0_4_ = auVar118._0_4_ * auVar141._0_4_;
            auVar168._4_4_ = auVar118._4_4_ * auVar141._4_4_;
            auVar168._8_4_ = auVar118._8_4_ * auVar141._8_4_;
            auVar168._12_4_ = auVar118._12_4_ * auVar141._12_4_;
            auVar118 = vminps_avx(auVar222,auVar168);
            auVar241._0_4_ = auVar171._0_4_ + auVar118._0_4_;
            auVar241._4_4_ = auVar171._4_4_ + auVar118._4_4_;
            auVar241._8_4_ = auVar171._8_4_ + auVar118._8_4_;
            auVar241._12_4_ = auVar171._12_4_ + auVar118._12_4_;
            auVar171 = vmaxps_avx(auVar168,auVar222);
            auVar124._0_4_ = auVar224._0_4_ + auVar171._0_4_;
            auVar124._4_4_ = auVar224._4_4_ + auVar171._4_4_;
            auVar124._8_4_ = auVar224._8_4_ + auVar171._8_4_;
            auVar124._12_4_ = auVar224._12_4_ + auVar171._12_4_;
            auVar224 = vsubps_avx(auVar166,auVar124);
            auVar171 = vsubps_avx(auVar166,auVar241);
            auVar223._0_4_ = fVar209 * auVar224._0_4_;
            auVar223._4_4_ = fVar296 * auVar224._4_4_;
            auVar223._8_4_ = fVar152 * auVar224._8_4_;
            auVar223._12_4_ = fVar297 * auVar224._12_4_;
            auVar242._0_4_ = fVar209 * auVar171._0_4_;
            auVar242._4_4_ = fVar296 * auVar171._4_4_;
            auVar242._8_4_ = fVar152 * auVar171._8_4_;
            auVar242._12_4_ = fVar297 * auVar171._12_4_;
            auVar125._0_4_ = fVar183 * auVar224._0_4_;
            auVar125._4_4_ = fVar185 * auVar224._4_4_;
            auVar125._8_4_ = fVar204 * auVar224._8_4_;
            auVar125._12_4_ = fVar207 * auVar224._12_4_;
            auVar169._0_4_ = fVar183 * auVar171._0_4_;
            auVar169._4_4_ = fVar185 * auVar171._4_4_;
            auVar169._8_4_ = fVar204 * auVar171._8_4_;
            auVar169._12_4_ = fVar207 * auVar171._12_4_;
            auVar224 = vminps_avx(auVar223,auVar242);
            auVar171 = vminps_avx(auVar125,auVar169);
            auVar224 = vminps_avx(auVar224,auVar171);
            auVar171 = vmaxps_avx(auVar242,auVar223);
            auVar118 = vmaxps_avx(auVar169,auVar125);
            auVar224 = vhaddps_avx(auVar224,auVar224);
            auVar171 = vmaxps_avx(auVar118,auVar171);
            auVar171 = vhaddps_avx(auVar171,auVar171);
            auVar118 = vmovshdup_avx(auVar15);
            auVar170 = ZEXT416((uint)(auVar118._0_4_ + auVar224._0_4_));
            auVar224 = vmaxss_avx(_local_5b8,auVar170);
            auVar118 = ZEXT416((uint)(auVar118._0_4_ + auVar171._0_4_));
            auVar171 = vminss_avx(auVar118,auVar78);
            auVar357._8_4_ = 0x7fffffff;
            auVar357._0_8_ = 0x7fffffff7fffffff;
            auVar357._12_4_ = 0x7fffffff;
            if (auVar224._0_4_ <= auVar171._0_4_) {
              uVar67 = 0;
              auVar367 = ZEXT864(0) << 0x20;
              if ((fVar153 < fVar179) && (fVar181 < fVar99)) {
                auVar224 = vcmpps_avx(auVar118,auVar78,1);
                auVar171 = vcmpps_avx(_local_5b8,auVar170,1);
                auVar224 = vandps_avx(auVar171,auVar224);
                uVar67 = auVar224._0_4_;
              }
              if (((uint)uVar69 < 4 && 0.001 <= fVar101) && (uVar67 & 1) == 0) {
                bVar52 = false;
              }
              else {
                lVar70 = 200;
                do {
                  fVar179 = auVar15._0_4_;
                  fVar101 = 1.0 - fVar179;
                  auVar224 = ZEXT416((uint)(fVar101 * fVar101 * fVar101));
                  auVar224 = vshufps_avx(auVar224,auVar224,0);
                  auVar171 = ZEXT416((uint)(fVar179 * 3.0 * fVar101 * fVar101));
                  auVar171 = vshufps_avx(auVar171,auVar171,0);
                  auVar118 = ZEXT416((uint)(fVar101 * fVar179 * fVar179 * 3.0));
                  auVar118 = vshufps_avx(auVar118,auVar118,0);
                  auVar170 = ZEXT416((uint)(fVar179 * fVar179 * fVar179));
                  auVar170 = vshufps_avx(auVar170,auVar170,0);
                  fVar101 = local_598 * auVar224._0_4_ +
                            local_508 * auVar171._0_4_ +
                            (float)local_3b8._0_4_ * auVar170._0_4_ + local_518 * auVar118._0_4_;
                  fVar179 = fStack_594 * auVar224._4_4_ +
                            fStack_504 * auVar171._4_4_ +
                            (float)local_3b8._4_4_ * auVar170._4_4_ + fStack_514 * auVar118._4_4_;
                  auVar126._0_8_ = CONCAT44(fVar179,fVar101);
                  auVar126._8_4_ =
                       fStack_590 * auVar224._8_4_ +
                       fStack_500 * auVar171._8_4_ +
                       fStack_3b0 * auVar170._8_4_ + fStack_510 * auVar118._8_4_;
                  auVar126._12_4_ =
                       fStack_58c * auVar224._12_4_ +
                       fStack_4fc * auVar171._12_4_ +
                       fStack_3ac * auVar170._12_4_ + fStack_50c * auVar118._12_4_;
                  auVar172._8_8_ = auVar126._0_8_;
                  auVar172._0_8_ = auVar126._0_8_;
                  auVar171 = vshufpd_avx(auVar126,auVar126,1);
                  auVar224 = vmovshdup_avx(auVar15);
                  auVar171 = vsubps_avx(auVar171,auVar172);
                  auVar127._0_4_ = auVar224._0_4_ * auVar171._0_4_ + fVar101;
                  auVar127._4_4_ = auVar224._4_4_ * auVar171._4_4_ + fVar179;
                  auVar127._8_4_ = auVar224._8_4_ * auVar171._8_4_ + fVar101;
                  auVar127._12_4_ = auVar224._12_4_ * auVar171._12_4_ + fVar179;
                  auVar224 = vshufps_avx(auVar127,auVar127,0);
                  auVar171 = vshufps_avx(auVar127,auVar127,0x55);
                  auVar173._0_4_ = auVar119._0_4_ * auVar224._0_4_ + auVar193._0_4_ * auVar171._0_4_
                  ;
                  auVar173._4_4_ = auVar119._4_4_ * auVar224._4_4_ + auVar193._4_4_ * auVar171._4_4_
                  ;
                  auVar173._8_4_ = auVar119._8_4_ * auVar224._8_4_ + auVar193._8_4_ * auVar171._8_4_
                  ;
                  auVar173._12_4_ =
                       auVar119._12_4_ * auVar224._12_4_ + auVar193._12_4_ * auVar171._12_4_;
                  auVar15 = vsubps_avx(auVar15,auVar173);
                  auVar224 = vandps_avx(auVar357,auVar127);
                  auVar171 = vshufps_avx(auVar224,auVar224,0xf5);
                  auVar224 = vmaxss_avx(auVar171,auVar224);
                  if (auVar224._0_4_ < fVar77) {
                    fVar101 = auVar15._0_4_;
                    if ((0.0 <= fVar101) && (fVar101 <= 1.0)) {
                      auVar119 = vmovshdup_avx(auVar15);
                      fVar179 = auVar119._0_4_;
                      if ((0.0 <= fVar179) && (fVar179 <= 1.0)) {
                        auVar119 = vinsertps_avx(ZEXT416((uint)(pLVar75->vx).field_0.m128[2]),
                                                 ZEXT416((uint)(pLVar75->vy).field_0.m128[2]),0x1c);
                        auVar141 = vinsertps_avx(auVar119,ZEXT416((uint)(pLVar75->vz).field_0.m128
                                                                        [2]),0x28);
                        auVar119 = vdpps_avx(auVar141,local_268,0x7f);
                        auVar193 = vdpps_avx(auVar141,local_278,0x7f);
                        auVar224 = vdpps_avx(auVar141,local_2a8,0x7f);
                        auVar171 = vdpps_avx(auVar141,local_2b8,0x7f);
                        auVar118 = vdpps_avx(auVar141,local_2c8,0x7f);
                        auVar170 = vdpps_avx(auVar141,local_2d8,0x7f);
                        fVar207 = 1.0 - fVar179;
                        auVar92 = vdpps_avx(auVar141,local_288,0x7f);
                        auVar141 = vdpps_avx(auVar141,local_298,0x7f);
                        fVar209 = 1.0 - fVar101;
                        fVar181 = auVar15._4_4_;
                        fVar183 = auVar15._8_4_;
                        fVar185 = auVar15._12_4_;
                        fVar204 = fVar209 * fVar101 * fVar101 * 3.0;
                        auVar225._0_4_ = fVar101 * fVar101 * fVar101;
                        auVar225._4_4_ = fVar181 * fVar181 * fVar181;
                        auVar225._8_4_ = fVar183 * fVar183 * fVar183;
                        auVar225._12_4_ = fVar185 * fVar185 * fVar185;
                        fVar181 = fVar101 * 3.0 * fVar209 * fVar209;
                        fVar183 = fVar209 * fVar209 * fVar209;
                        fVar101 = (fVar207 * auVar119._0_4_ + fVar179 * auVar224._0_4_) * fVar183 +
                                  (fVar207 * auVar193._0_4_ + fVar179 * auVar171._0_4_) * fVar181 +
                                  fVar204 * (fVar207 * auVar92._0_4_ + fVar179 * auVar118._0_4_) +
                                  auVar225._0_4_ *
                                  (auVar170._0_4_ * fVar179 + fVar207 * auVar141._0_4_);
                        if ((fVar105 <= fVar101) &&
                           (fVar179 = *(float *)(ray + k * 4 + 0x80), fVar101 <= fVar179)) {
                          pGVar8 = (context->scene->geometries).items[local_400].ptr;
                          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar76 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar76 = true,
                                  pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_1a8 = vshufps_avx(auVar15,auVar15,0x55);
                            auVar280._8_4_ = 0x3f800000;
                            auVar280._0_8_ = &DAT_3f8000003f800000;
                            auVar280._12_4_ = 0x3f800000;
                            auVar119 = vsubps_avx(auVar280,local_1a8);
                            fVar185 = local_1a8._0_4_;
                            fVar207 = local_1a8._4_4_;
                            fVar296 = local_1a8._8_4_;
                            fVar152 = local_1a8._12_4_;
                            fVar297 = auVar119._0_4_;
                            fVar298 = auVar119._4_4_;
                            fVar311 = auVar119._8_4_;
                            fVar229 = auVar119._12_4_;
                            auVar294._0_4_ =
                                 fVar185 * (float)local_3e8._0_4_ + fVar297 * (float)local_3c8._0_4_
                            ;
                            auVar294._4_4_ =
                                 fVar207 * (float)local_3e8._4_4_ + fVar298 * (float)local_3c8._4_4_
                            ;
                            auVar294._8_4_ = fVar296 * fStack_3e0 + fVar311 * fStack_3c0;
                            auVar294._12_4_ = fVar152 * fStack_3dc + fVar229 * fStack_3bc;
                            auVar309._0_4_ = fVar185 * (float)local_3f8._0_4_ + fVar297 * fVar212;
                            auVar309._4_4_ = fVar207 * (float)local_3f8._4_4_ + fVar298 * fVar100;
                            auVar309._8_4_ = fVar296 * fStack_3f0 + fVar311 * fVar184;
                            auVar309._12_4_ = fVar152 * fStack_3ec + fVar229 * fVar210;
                            auVar318._0_4_ = fVar185 * fVar227 + fVar297 * (float)local_3d8._0_4_;
                            auVar318._4_4_ = fVar207 * fVar180 + fVar298 * (float)local_3d8._4_4_;
                            auVar318._8_4_ = fVar296 * fVar205 + fVar311 * fStack_3d0;
                            auVar318._12_4_ = fVar152 * fVar103 + fVar229 * fStack_3cc;
                            auVar281._0_4_ = fVar185 * fVar228 + fVar297 * fVar226;
                            auVar281._4_4_ = fVar207 * fVar182 + fVar298 * fVar154;
                            auVar281._8_4_ = fVar296 * fVar208 + fVar311 * fVar186;
                            auVar281._12_4_ = fVar152 * fVar104 + fVar229 * fVar102;
                            auVar171 = vsubps_avx(auVar309,auVar294);
                            auVar118 = vsubps_avx(auVar318,auVar309);
                            auVar170 = vsubps_avx(auVar281,auVar318);
                            local_1b8 = vshufps_avx(auVar15,auVar15,0);
                            fVar185 = local_1b8._0_4_;
                            fVar296 = local_1b8._4_4_;
                            fVar152 = local_1b8._8_4_;
                            fVar298 = local_1b8._12_4_;
                            auVar119 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
                            fVar207 = auVar119._0_4_;
                            fVar209 = auVar119._4_4_;
                            fVar297 = auVar119._8_4_;
                            fVar311 = auVar119._12_4_;
                            auVar119 = vshufps_avx(auVar225,auVar225,0);
                            auVar193 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
                            auVar224 = vshufps_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar181),0);
                            auVar200._0_4_ =
                                 ((auVar118._0_4_ * fVar207 + auVar170._0_4_ * fVar185) * fVar185 +
                                 (auVar171._0_4_ * fVar207 + auVar118._0_4_ * fVar185) * fVar207) *
                                 3.0;
                            auVar200._4_4_ =
                                 ((auVar118._4_4_ * fVar209 + auVar170._4_4_ * fVar296) * fVar296 +
                                 (auVar171._4_4_ * fVar209 + auVar118._4_4_ * fVar296) * fVar209) *
                                 3.0;
                            auVar200._8_4_ =
                                 ((auVar118._8_4_ * fVar297 + auVar170._8_4_ * fVar152) * fVar152 +
                                 (auVar171._8_4_ * fVar297 + auVar118._8_4_ * fVar152) * fVar297) *
                                 3.0;
                            auVar200._12_4_ =
                                 ((auVar118._12_4_ * fVar311 + auVar170._12_4_ * fVar298) * fVar298
                                 + (auVar171._12_4_ * fVar311 + auVar118._12_4_ * fVar298) * fVar311
                                 ) * 3.0;
                            auVar171 = vshufps_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar183),0);
                            auVar146._0_4_ =
                                 auVar171._0_4_ * (float)local_328._0_4_ +
                                 auVar224._0_4_ * (float)local_338._0_4_ +
                                 auVar119._0_4_ * (float)local_358._0_4_ +
                                 auVar193._0_4_ * (float)local_348._0_4_;
                            auVar146._4_4_ =
                                 auVar171._4_4_ * (float)local_328._4_4_ +
                                 auVar224._4_4_ * (float)local_338._4_4_ +
                                 auVar119._4_4_ * (float)local_358._4_4_ +
                                 auVar193._4_4_ * (float)local_348._4_4_;
                            auVar146._8_4_ =
                                 auVar171._8_4_ * fStack_320 +
                                 auVar224._8_4_ * fStack_330 +
                                 auVar119._8_4_ * fStack_350 + auVar193._8_4_ * fStack_340;
                            auVar146._12_4_ =
                                 auVar171._12_4_ * fStack_31c +
                                 auVar224._12_4_ * fStack_32c +
                                 auVar119._12_4_ * fStack_34c + auVar193._12_4_ * fStack_33c;
                            auVar119 = vshufps_avx(auVar200,auVar200,0xc9);
                            auVar174._0_4_ = auVar146._0_4_ * auVar119._0_4_;
                            auVar174._4_4_ = auVar146._4_4_ * auVar119._4_4_;
                            auVar174._8_4_ = auVar146._8_4_ * auVar119._8_4_;
                            auVar174._12_4_ = auVar146._12_4_ * auVar119._12_4_;
                            auVar119 = vshufps_avx(auVar146,auVar146,0xc9);
                            auVar147._0_4_ = auVar200._0_4_ * auVar119._0_4_;
                            auVar147._4_4_ = auVar200._4_4_ * auVar119._4_4_;
                            auVar147._8_4_ = auVar200._8_4_ * auVar119._8_4_;
                            auVar147._12_4_ = auVar200._12_4_ * auVar119._12_4_;
                            auVar193 = vsubps_avx(auVar147,auVar174);
                            auVar119 = vshufps_avx(auVar193,auVar193,0x55);
                            local_1e8[0] = (RTCHitN)auVar119[0];
                            local_1e8[1] = (RTCHitN)auVar119[1];
                            local_1e8[2] = (RTCHitN)auVar119[2];
                            local_1e8[3] = (RTCHitN)auVar119[3];
                            local_1e8[4] = (RTCHitN)auVar119[4];
                            local_1e8[5] = (RTCHitN)auVar119[5];
                            local_1e8[6] = (RTCHitN)auVar119[6];
                            local_1e8[7] = (RTCHitN)auVar119[7];
                            local_1e8[8] = (RTCHitN)auVar119[8];
                            local_1e8[9] = (RTCHitN)auVar119[9];
                            local_1e8[10] = (RTCHitN)auVar119[10];
                            local_1e8[0xb] = (RTCHitN)auVar119[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar119[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar119[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar119[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar119[0xf];
                            local_1d8 = vshufps_avx(auVar193,auVar193,0xaa);
                            local_1c8 = vshufps_avx(auVar193,auVar193,0);
                            local_198 = local_318._0_8_;
                            uStack_190 = local_318._8_8_;
                            local_188 = local_308._0_8_;
                            uStack_180 = local_308._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar101;
                            local_428 = *local_418;
                            uStack_420 = local_418[1];
                            local_388.valid = (int *)&local_428;
                            local_388.geometryUserPtr = pGVar8->userPtr;
                            local_388.context = context->user;
                            local_388.ray = (RTCRayN *)ray;
                            local_388.hit = local_1e8;
                            local_388.N = 4;
                            if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar8->occlusionFilterN)(&local_388);
                            }
                            auVar63._8_8_ = uStack_420;
                            auVar63._0_8_ = local_428;
                            if (auVar63 == (undefined1  [16])0x0) {
                              auVar367 = ZEXT1664(ZEXT816(0));
                              auVar119 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar119 = auVar119 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var13 = context->args->filter;
                              auVar367 = ZEXT1664(ZEXT816(0));
                              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var13)(&local_388);
                                auVar367 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar64._8_8_ = uStack_420;
                              auVar64._0_8_ = local_428;
                              auVar193 = vpcmpeqd_avx(auVar367._0_16_,auVar64);
                              auVar119 = auVar193 ^ _DAT_01febe20;
                              auVar148._8_4_ = 0xff800000;
                              auVar148._0_8_ = 0xff800000ff800000;
                              auVar148._12_4_ = 0xff800000;
                              auVar193 = vblendvps_avx(auVar148,*(undefined1 (*) [16])
                                                                 (local_388.ray + 0x80),auVar193);
                              *(undefined1 (*) [16])(local_388.ray + 0x80) = auVar193;
                            }
                            auVar119 = vpslld_avx(auVar119,0x1f);
                            iVar68 = vmovmskps_avx(auVar119);
                            if (iVar68 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar179;
                            }
                            bVar76 = (char)iVar68 != '\0';
                          }
                          bVar65 = (bool)(bVar65 | bVar76);
                          pLVar75 = local_410;
                        }
                      }
                    }
                    break;
                  }
                  lVar70 = lVar70 + -1;
                } while (lVar70 != 0);
              }
              goto LAB_01092680;
            }
          }
          goto LAB_01092a31;
        }
      }
LAB_01092680:
    } while (bVar52);
    local_2e8 = vinsertps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar99),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }